

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  undefined4 uVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined3 uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined6 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  byte bVar60;
  ulong uVar61;
  ulong uVar62;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar63;
  ulong uVar64;
  int iVar65;
  RTCIntersectArguments *pRVar66;
  RTCIntersectArguments *pRVar67;
  ulong uVar68;
  undefined1 auVar69 [8];
  long lVar70;
  bool bVar71;
  uint uVar72;
  uint uVar73;
  int iVar74;
  uint uVar75;
  uint uVar76;
  short sVar77;
  float t1;
  undefined2 uVar106;
  float fVar78;
  float fVar107;
  float fVar108;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar109;
  float fVar128;
  float fVar129;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar147;
  float fVar148;
  vfloat4 v;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar165;
  float fVar166;
  vfloat4 v_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar170;
  float fVar171;
  vfloat4 a;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  float fVar195;
  float fVar196;
  vfloat_impl<4> p00;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar207;
  float fVar208;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar218;
  float fVar219;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar253;
  float fVar256;
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar272;
  float fVar275;
  vfloat4 a_1;
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  float fVar273;
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar283;
  float fVar284;
  float fVar293;
  float fVar295;
  vfloat4 a_2;
  float fVar297;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar299;
  float fVar300;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar305 [16];
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar315;
  float fVar316;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 uVar105;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar163 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  
  PVar17 = prim[1];
  uVar61 = (ulong)(byte)PVar17;
  lVar24 = uVar61 * 0x25;
  pPVar8 = prim + lVar24 + 6;
  fVar148 = *(float *)(pPVar8 + 0xc);
  fVar149 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar148;
  fVar165 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar148;
  fVar166 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar148;
  fVar130 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar147 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar148 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar18 = *(undefined4 *)(prim + uVar61 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar62;
  auVar123._12_2_ = uVar106;
  auVar123._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar132._12_4_ = auVar123._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar62;
  auVar132._10_2_ = uVar106;
  auVar79._10_6_ = auVar132._10_6_;
  auVar79._8_2_ = uVar106;
  auVar79._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  fVar315 = (float)((int)sVar77 >> 8);
  fVar320 = (float)(auVar38._0_4_ >> 0x18);
  fVar321 = (float)(auVar79._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar62;
  auVar112._12_2_ = uVar106;
  auVar112._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar62;
  auVar111._10_2_ = uVar106;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar106;
  auVar110._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar39._4_8_ = auVar110._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar167 = (float)((int)sVar77 >> 8);
  fVar170 = (float)(auVar39._0_4_ >> 0x18);
  fVar171 = (float)(auVar110._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar62;
  auVar115._12_2_ = uVar106;
  auVar115._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar62;
  auVar114._10_2_ = uVar106;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar106;
  auVar113._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar40._4_8_ = auVar113._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  fVar197 = (float)((int)sVar77 >> 8);
  fVar207 = (float)(auVar40._0_4_ >> 0x18);
  fVar208 = (float)(auVar113._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 0xf + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar62;
  auVar118._12_2_ = uVar106;
  auVar118._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar62;
  auVar117._10_2_ = uVar106;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar106;
  auVar116._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar41._4_8_ = auVar116._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  fVar78 = (float)((int)sVar77 >> 8);
  fVar107 = (float)(auVar41._0_4_ >> 0x18);
  fVar108 = (float)(auVar116._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar62;
  auVar175._12_2_ = uVar106;
  auVar175._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar62;
  auVar174._10_2_ = uVar106;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar106;
  auVar173._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar42._4_8_ = auVar173._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  fVar209 = (float)((int)sVar77 >> 8);
  fVar218 = (float)(auVar42._0_4_ >> 0x18);
  fVar219 = (float)(auVar173._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar61 + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar62;
  auVar178._12_2_ = uVar106;
  auVar178._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar62;
  auVar177._10_2_ = uVar106;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar106;
  auVar176._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar43._4_8_ = auVar176._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  fVar240 = (float)((int)sVar77 >> 8);
  fVar253 = (float)(auVar43._0_4_ >> 0x18);
  fVar256 = (float)(auVar176._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 0x1a + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar62;
  auVar181._12_2_ = uVar106;
  auVar181._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar62;
  auVar180._10_2_ = uVar106;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar106;
  auVar179._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar44._4_8_ = auVar179._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  fVar224 = (float)((int)sVar77 >> 8);
  fVar235 = (float)(auVar44._0_4_ >> 0x18);
  fVar237 = (float)(auVar179._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 0x1b + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar62;
  auVar184._12_2_ = uVar106;
  auVar184._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar62;
  auVar183._10_2_ = uVar106;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar106;
  auVar182._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar45._4_8_ = auVar182._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  fVar261 = (float)((int)sVar77 >> 8);
  fVar272 = (float)(auVar45._0_4_ >> 0x18);
  fVar275 = (float)(auVar182._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar61 * 0x1c + 6);
  uVar105 = (undefined1)((uint)uVar18 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar18 >> 0x10);
  uVar35 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar18));
  uVar105 = (undefined1)((uint)uVar18 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),uVar105),uVar105);
  sVar77 = CONCAT11((char)uVar18,(char)uVar18);
  uVar62 = CONCAT62(uVar37,sVar77);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar62;
  auVar187._12_2_ = uVar106;
  auVar187._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar35 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar62;
  auVar186._10_2_ = uVar106;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar106;
  auVar185._0_8_ = uVar62;
  uVar106 = (undefined2)uVar37;
  auVar46._4_8_ = auVar185._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  fVar109 = (float)((int)sVar77 >> 8);
  fVar128 = (float)(auVar46._0_4_ >> 0x18);
  fVar129 = (float)(auVar185._8_4_ >> 0x18);
  fVar299 = fVar130 * fVar315 + fVar147 * fVar167 + fVar148 * fVar197;
  fVar309 = fVar130 * fVar320 + fVar147 * fVar170 + fVar148 * fVar207;
  fVar311 = fVar130 * fVar321 + fVar147 * fVar171 + fVar148 * fVar208;
  fVar313 = fVar130 * (float)(auVar132._12_4_ >> 0x18) +
            fVar147 * (float)(auVar111._12_4_ >> 0x18) + fVar148 * (float)(auVar114._12_4_ >> 0x18);
  fVar283 = fVar130 * fVar78 + fVar147 * fVar209 + fVar148 * fVar240;
  fVar293 = fVar130 * fVar107 + fVar147 * fVar218 + fVar148 * fVar253;
  fVar295 = fVar130 * fVar108 + fVar147 * fVar219 + fVar148 * fVar256;
  fVar297 = fVar130 * (float)(auVar117._12_4_ >> 0x18) +
            fVar147 * (float)(auVar174._12_4_ >> 0x18) + fVar148 * (float)(auVar177._12_4_ >> 0x18);
  fVar172 = fVar130 * fVar224 + fVar147 * fVar261 + fVar148 * fVar109;
  fVar195 = fVar130 * fVar235 + fVar147 * fVar272 + fVar148 * fVar128;
  fVar196 = fVar130 * fVar237 + fVar147 * fVar275 + fVar148 * fVar129;
  fVar130 = fVar130 * (float)(auVar180._12_4_ >> 0x18) +
            fVar147 * (float)(auVar183._12_4_ >> 0x18) + fVar148 * (float)(auVar186._12_4_ >> 0x18);
  fVar316 = fVar315 * fVar149 + fVar167 * fVar165 + fVar197 * fVar166;
  fVar320 = fVar320 * fVar149 + fVar170 * fVar165 + fVar207 * fVar166;
  fVar321 = fVar321 * fVar149 + fVar171 * fVar165 + fVar208 * fVar166;
  fVar322 = (float)(auVar132._12_4_ >> 0x18) * fVar149 +
            (float)(auVar111._12_4_ >> 0x18) * fVar165 + (float)(auVar114._12_4_ >> 0x18) * fVar166;
  fVar240 = fVar78 * fVar149 + fVar209 * fVar165 + fVar240 * fVar166;
  fVar253 = fVar107 * fVar149 + fVar218 * fVar165 + fVar253 * fVar166;
  fVar256 = fVar108 * fVar149 + fVar219 * fVar165 + fVar256 * fVar166;
  fVar315 = (float)(auVar117._12_4_ >> 0x18) * fVar149 +
            (float)(auVar174._12_4_ >> 0x18) * fVar165 + (float)(auVar177._12_4_ >> 0x18) * fVar166;
  fVar224 = fVar149 * fVar224 + fVar165 * fVar261 + fVar166 * fVar109;
  fVar235 = fVar149 * fVar235 + fVar165 * fVar272 + fVar166 * fVar128;
  fVar237 = fVar149 * fVar237 + fVar165 * fVar275 + fVar166 * fVar129;
  fVar261 = fVar149 * (float)(auVar180._12_4_ >> 0x18) +
            fVar165 * (float)(auVar183._12_4_ >> 0x18) + fVar166 * (float)(auVar186._12_4_ >> 0x18);
  fVar148 = (float)DAT_01ff1d40;
  fVar78 = DAT_01ff1d40._4_4_;
  fVar107 = DAT_01ff1d40._8_4_;
  fVar108 = DAT_01ff1d40._12_4_;
  uVar72 = -(uint)(fVar148 <= ABS(fVar299));
  uVar73 = -(uint)(fVar78 <= ABS(fVar309));
  uVar75 = -(uint)(fVar107 <= ABS(fVar311));
  uVar76 = -(uint)(fVar108 <= ABS(fVar313));
  auVar301._0_4_ = (uint)fVar299 & uVar72;
  auVar301._4_4_ = (uint)fVar309 & uVar73;
  auVar301._8_4_ = (uint)fVar311 & uVar75;
  auVar301._12_4_ = (uint)fVar313 & uVar76;
  auVar150._0_4_ = ~uVar72 & (uint)fVar148;
  auVar150._4_4_ = ~uVar73 & (uint)fVar78;
  auVar150._8_4_ = ~uVar75 & (uint)fVar107;
  auVar150._12_4_ = ~uVar76 & (uint)fVar108;
  auVar150 = auVar150 | auVar301;
  uVar72 = -(uint)(fVar148 <= ABS(fVar283));
  uVar73 = -(uint)(fVar78 <= ABS(fVar293));
  uVar75 = -(uint)(fVar107 <= ABS(fVar295));
  uVar76 = -(uint)(fVar108 <= ABS(fVar297));
  auVar285._0_4_ = (uint)fVar283 & uVar72;
  auVar285._4_4_ = (uint)fVar293 & uVar73;
  auVar285._8_4_ = (uint)fVar295 & uVar75;
  auVar285._12_4_ = (uint)fVar297 & uVar76;
  auVar198._0_4_ = ~uVar72 & (uint)fVar148;
  auVar198._4_4_ = ~uVar73 & (uint)fVar78;
  auVar198._8_4_ = ~uVar75 & (uint)fVar107;
  auVar198._12_4_ = ~uVar76 & (uint)fVar108;
  auVar198 = auVar198 | auVar285;
  uVar72 = -(uint)(fVar148 <= ABS(fVar172));
  uVar73 = -(uint)(fVar78 <= ABS(fVar195));
  uVar75 = -(uint)(fVar107 <= ABS(fVar196));
  uVar76 = -(uint)(fVar108 <= ABS(fVar130));
  auVar188._0_4_ = (uint)fVar172 & uVar72;
  auVar188._4_4_ = (uint)fVar195 & uVar73;
  auVar188._8_4_ = (uint)fVar196 & uVar75;
  auVar188._12_4_ = (uint)fVar130 & uVar76;
  auVar210._0_4_ = ~uVar72 & (uint)fVar148;
  auVar210._4_4_ = ~uVar73 & (uint)fVar78;
  auVar210._8_4_ = ~uVar75 & (uint)fVar107;
  auVar210._12_4_ = ~uVar76 & (uint)fVar108;
  auVar210 = auVar210 | auVar188;
  auVar79 = rcpps(_DAT_01ff1d40,auVar150);
  fVar148 = auVar79._0_4_;
  fVar108 = auVar79._4_4_;
  fVar167 = auVar79._8_4_;
  fVar209 = auVar79._12_4_;
  fVar148 = (1.0 - auVar150._0_4_ * fVar148) * fVar148 + fVar148;
  fVar108 = (1.0 - auVar150._4_4_ * fVar108) * fVar108 + fVar108;
  fVar167 = (1.0 - auVar150._8_4_ * fVar167) * fVar167 + fVar167;
  fVar209 = (1.0 - auVar150._12_4_ * fVar209) * fVar209 + fVar209;
  auVar79 = rcpps(auVar79,auVar198);
  fVar78 = auVar79._0_4_;
  fVar109 = auVar79._4_4_;
  fVar170 = auVar79._8_4_;
  fVar218 = auVar79._12_4_;
  fVar78 = (1.0 - auVar198._0_4_ * fVar78) * fVar78 + fVar78;
  fVar109 = (1.0 - auVar198._4_4_ * fVar109) * fVar109 + fVar109;
  fVar170 = (1.0 - auVar198._8_4_ * fVar170) * fVar170 + fVar170;
  fVar218 = (1.0 - auVar198._12_4_ * fVar218) * fVar218 + fVar218;
  auVar79 = rcpps(auVar79,auVar210);
  fVar107 = auVar79._0_4_;
  fVar128 = auVar79._4_4_;
  fVar171 = auVar79._8_4_;
  fVar219 = auVar79._12_4_;
  fVar107 = (1.0 - auVar210._0_4_ * fVar107) * fVar107 + fVar107;
  fVar128 = (1.0 - auVar210._4_4_ * fVar128) * fVar128 + fVar128;
  fVar171 = (1.0 - auVar210._8_4_ * fVar171) * fVar171 + fVar171;
  fVar219 = (1.0 - auVar210._12_4_ * fVar219) * fVar219 + fVar219;
  fVar272 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar61 * 7 + 6);
  uVar106 = (undefined2)(uVar62 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar62;
  auVar80._12_2_ = uVar106;
  auVar80._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar62 >> 0x20);
  auVar324._12_4_ = auVar80._12_4_;
  auVar324._8_2_ = 0;
  auVar324._0_8_ = uVar62;
  auVar324._10_2_ = uVar106;
  auVar134._10_6_ = auVar324._10_6_;
  auVar134._8_2_ = uVar106;
  auVar134._0_8_ = uVar62;
  uVar106 = (undefined2)(uVar62 >> 0x10);
  auVar47._4_8_ = auVar134._8_8_;
  auVar47._2_2_ = uVar106;
  auVar47._0_2_ = uVar106;
  fVar129 = (float)(auVar47._0_4_ >> 0x10);
  fVar172 = (float)(auVar134._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar61 * 0xb + 6);
  uVar106 = (undefined2)(uVar9 >> 0x30);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar9;
  auVar153._12_2_ = uVar106;
  auVar153._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar9 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar9;
  auVar152._10_2_ = uVar106;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = uVar106;
  auVar151._0_8_ = uVar9;
  uVar106 = (undefined2)(uVar9 >> 0x10);
  auVar48._4_8_ = auVar151._8_8_;
  auVar48._2_2_ = uVar106;
  auVar48._0_2_ = uVar106;
  uVar64 = *(ulong *)(prim + uVar61 * 9 + 6);
  uVar106 = (undefined2)(uVar64 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar64;
  auVar83._12_2_ = uVar106;
  auVar83._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar64 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._10_2_ = uVar106;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar106;
  auVar81._0_8_ = uVar64;
  uVar106 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar81._8_8_;
  auVar49._2_2_ = uVar106;
  auVar49._0_2_ = uVar106;
  fVar130 = (float)(auVar49._0_4_ >> 0x10);
  fVar195 = (float)(auVar81._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar61 * 0xd + 6);
  uVar106 = (undefined2)(uVar10 >> 0x30);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar10;
  auVar213._12_2_ = uVar106;
  auVar213._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar10 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar10;
  auVar212._10_2_ = uVar106;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar106;
  auVar211._0_8_ = uVar10;
  uVar106 = (undefined2)(uVar10 >> 0x10);
  auVar50._4_8_ = auVar211._8_8_;
  auVar50._2_2_ = uVar106;
  auVar50._0_2_ = uVar106;
  uVar11 = *(ulong *)(prim + uVar61 * 0x12 + 6);
  uVar106 = (undefined2)(uVar11 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar11;
  auVar86._12_2_ = uVar106;
  auVar86._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar11 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar11;
  auVar85._10_2_ = uVar106;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar106;
  auVar84._0_8_ = uVar11;
  uVar106 = (undefined2)(uVar11 >> 0x10);
  auVar51._4_8_ = auVar84._8_8_;
  auVar51._2_2_ = uVar106;
  auVar51._0_2_ = uVar106;
  fVar147 = (float)(auVar51._0_4_ >> 0x10);
  fVar196 = (float)(auVar84._8_4_ >> 0x10);
  uVar68 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar61 * 2 + uVar68 + 6);
  uVar106 = (undefined2)(uVar12 >> 0x30);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar12;
  auVar245._12_2_ = uVar106;
  auVar245._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar12 >> 0x20);
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._8_2_ = 0;
  auVar244._0_8_ = uVar12;
  auVar244._10_2_ = uVar106;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._8_2_ = uVar106;
  auVar243._0_8_ = uVar12;
  uVar106 = (undefined2)(uVar12 >> 0x10);
  auVar52._4_8_ = auVar243._8_8_;
  auVar52._2_2_ = uVar106;
  auVar52._0_2_ = uVar106;
  uVar68 = *(ulong *)(prim + uVar68 + 6);
  uVar106 = (undefined2)(uVar68 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar68;
  auVar89._12_2_ = uVar106;
  auVar89._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar68 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar68;
  auVar88._10_2_ = uVar106;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar106;
  auVar87._0_8_ = uVar68;
  uVar106 = (undefined2)(uVar68 >> 0x10);
  auVar53._4_8_ = auVar87._8_8_;
  auVar53._2_2_ = uVar106;
  auVar53._0_2_ = uVar106;
  fVar149 = (float)(auVar53._0_4_ >> 0x10);
  fVar197 = (float)(auVar87._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar61 * 0x18 + 6);
  uVar106 = (undefined2)(uVar13 >> 0x30);
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar13;
  auVar266._12_2_ = uVar106;
  auVar266._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar13 >> 0x20);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar13;
  auVar265._10_2_ = uVar106;
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._8_2_ = uVar106;
  auVar264._0_8_ = uVar13;
  uVar106 = (undefined2)(uVar13 >> 0x10);
  auVar54._4_8_ = auVar264._8_8_;
  auVar54._2_2_ = uVar106;
  auVar54._0_2_ = uVar106;
  uVar14 = *(ulong *)(prim + uVar61 * 0x1d + 6);
  uVar106 = (undefined2)(uVar14 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar14;
  auVar92._12_2_ = uVar106;
  auVar92._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar14 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar14;
  auVar91._10_2_ = uVar106;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar106;
  auVar90._0_8_ = uVar14;
  uVar106 = (undefined2)(uVar14 >> 0x10);
  auVar55._4_8_ = auVar90._8_8_;
  auVar55._2_2_ = uVar106;
  auVar55._0_2_ = uVar106;
  fVar165 = (float)(auVar55._0_4_ >> 0x10);
  fVar207 = (float)(auVar90._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar106 = (undefined2)(uVar15 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar15;
  auVar288._12_2_ = uVar106;
  auVar288._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar15 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar15;
  auVar287._10_2_ = uVar106;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar106;
  auVar286._0_8_ = uVar15;
  uVar106 = (undefined2)(uVar15 >> 0x10);
  auVar56._4_8_ = auVar286._8_8_;
  auVar56._2_2_ = uVar106;
  auVar56._0_2_ = uVar106;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar61) + 6);
  uVar106 = (undefined2)(uVar16 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar16;
  auVar95._12_2_ = uVar106;
  auVar95._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar16 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar16;
  auVar94._10_2_ = uVar106;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar106;
  auVar93._0_8_ = uVar16;
  uVar106 = (undefined2)(uVar16 >> 0x10);
  auVar57._4_8_ = auVar93._8_8_;
  auVar57._2_2_ = uVar106;
  auVar57._0_2_ = uVar106;
  fVar166 = (float)(auVar57._0_4_ >> 0x10);
  fVar208 = (float)(auVar93._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar61 * 0x23 + 6);
  uVar106 = (undefined2)(uVar61 >> 0x30);
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar61;
  auVar304._12_2_ = uVar106;
  auVar304._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar61 >> 0x20);
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._8_2_ = 0;
  auVar303._0_8_ = uVar61;
  auVar303._10_2_ = uVar106;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._8_2_ = uVar106;
  auVar302._0_8_ = uVar61;
  uVar106 = (undefined2)(uVar61 >> 0x10);
  auVar58._4_8_ = auVar302._8_8_;
  auVar58._2_2_ = uVar106;
  auVar58._0_2_ = uVar106;
  auVar154._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar129) * fVar272 + fVar129) - fVar320) *
                fVar108,((((float)(int)(short)uVar9 - (float)(int)(short)uVar62) * fVar272 +
                         (float)(int)(short)uVar62) - fVar316) * fVar148);
  auVar154._8_4_ =
       ((((float)(auVar151._8_4_ >> 0x10) - fVar172) * fVar272 + fVar172) - fVar321) * fVar167;
  auVar154._12_4_ =
       ((((float)(auVar152._12_4_ >> 0x10) - (float)(auVar324._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar324._12_4_ >> 0x10)) - fVar322) * fVar209;
  auVar214._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar64) * fVar272 +
        (float)(int)(short)uVar64) - fVar316) * fVar148;
  auVar214._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar130) * fVar272 + fVar130) - fVar320) * fVar108;
  auVar214._8_4_ =
       ((((float)(auVar211._8_4_ >> 0x10) - fVar195) * fVar272 + fVar195) - fVar321) * fVar167;
  auVar214._12_4_ =
       ((((float)(auVar212._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar322) * fVar209;
  auVar246._0_8_ =
       CONCAT44(((((float)(auVar52._0_4_ >> 0x10) - fVar147) * fVar272 + fVar147) - fVar253) *
                fVar109,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar272 +
                         (float)(int)(short)uVar11) - fVar240) * fVar78);
  auVar246._8_4_ =
       ((((float)(auVar243._8_4_ >> 0x10) - fVar196) * fVar272 + fVar196) - fVar256) * fVar170;
  auVar246._12_4_ =
       ((((float)(auVar244._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar315) * fVar218;
  auVar267._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar68) * fVar272 +
        (float)(int)(short)uVar68) - fVar240) * fVar78;
  auVar267._4_4_ =
       ((((float)(auVar54._0_4_ >> 0x10) - fVar149) * fVar272 + fVar149) - fVar253) * fVar109;
  auVar267._8_4_ =
       ((((float)(auVar264._8_4_ >> 0x10) - fVar197) * fVar272 + fVar197) - fVar256) * fVar170;
  auVar267._12_4_ =
       ((((float)(auVar265._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar315) * fVar218;
  auVar289._0_8_ =
       CONCAT44(((((float)(auVar56._0_4_ >> 0x10) - fVar165) * fVar272 + fVar165) - fVar235) *
                fVar128,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar272 +
                         (float)(int)(short)uVar14) - fVar224) * fVar107);
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar207) * fVar272 + fVar207) - fVar237) * fVar171;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar261) * fVar219;
  auVar305._0_4_ =
       ((((float)(int)(short)uVar61 - (float)(int)(short)uVar16) * fVar272 +
        (float)(int)(short)uVar16) - fVar224) * fVar107;
  auVar305._4_4_ =
       ((((float)(auVar58._0_4_ >> 0x10) - fVar166) * fVar272 + fVar166) - fVar235) * fVar128;
  auVar305._8_4_ =
       ((((float)(auVar302._8_4_ >> 0x10) - fVar208) * fVar272 + fVar208) - fVar237) * fVar171;
  auVar305._12_4_ =
       ((((float)(auVar303._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar272 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar261) * fVar219;
  auVar131._8_4_ = auVar154._8_4_;
  auVar131._0_8_ = auVar154._0_8_;
  auVar131._12_4_ = auVar154._12_4_;
  auVar132 = minps(auVar131,auVar214);
  auVar96._8_4_ = auVar246._8_4_;
  auVar96._0_8_ = auVar246._0_8_;
  auVar96._12_4_ = auVar246._12_4_;
  auVar79 = minps(auVar96,auVar267);
  auVar132 = maxps(auVar132,auVar79);
  auVar97._8_4_ = auVar289._8_4_;
  auVar97._0_8_ = auVar289._0_8_;
  auVar97._12_4_ = auVar289._12_4_;
  auVar79 = minps(auVar97,auVar305);
  uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar119._4_4_ = uVar18;
  auVar119._0_4_ = uVar18;
  auVar119._8_4_ = uVar18;
  auVar119._12_4_ = uVar18;
  auVar79 = maxps(auVar79,auVar119);
  auVar79 = maxps(auVar132,auVar79);
  local_1b8 = auVar79._0_4_ * 0.99999964;
  fStack_1b4 = auVar79._4_4_ * 0.99999964;
  fStack_1b0 = auVar79._8_4_ * 0.99999964;
  fStack_1ac = auVar79._12_4_ * 0.99999964;
  auVar79 = maxps(auVar154,auVar214);
  auVar132 = maxps(auVar246,auVar267);
  auVar79 = minps(auVar79,auVar132);
  auVar132 = maxps(auVar289,auVar305);
  fVar148 = (ray->super_RayK<1>).tfar;
  auVar98._4_4_ = fVar148;
  auVar98._0_4_ = fVar148;
  auVar98._8_4_ = fVar148;
  auVar98._12_4_ = fVar148;
  auVar132 = minps(auVar132,auVar98);
  auVar79 = minps(auVar79,auVar132);
  uVar72 = (uint)(byte)PVar17;
  auVar120._0_4_ = -(uint)(uVar72 != 0 && local_1b8 <= auVar79._0_4_ * 1.0000004);
  auVar120._4_4_ = -(uint)(1 < uVar72 && fStack_1b4 <= auVar79._4_4_ * 1.0000004);
  auVar120._8_4_ = -(uint)(2 < uVar72 && fStack_1b0 <= auVar79._8_4_ * 1.0000004);
  auVar120._12_4_ = -(uint)(3 < uVar72 && fStack_1ac <= auVar79._12_4_ * 1.0000004);
  uVar72 = movmskps(uVar72,auVar120);
  if (uVar72 == 0) {
    return;
  }
  uVar72 = uVar72 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f0 = prim;
LAB_00bcdb72:
  lVar24 = 0;
  if ((ulong)uVar72 != 0) {
    for (; (uVar72 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
    }
  }
  uVar73 = *(uint *)(local_2f0 + 2);
  uVar75 = *(uint *)(local_2f0 + lVar24 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar73].ptr;
  fVar148 = pGVar19->fnumTimeSegments;
  fVar78 = (pGVar19->time_range).lower;
  fVar107 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar78) /
            ((pGVar19->time_range).upper - fVar78)) * fVar148;
  fVar78 = floorf(fVar107);
  fVar148 = fVar148 + -1.0;
  if (fVar148 <= fVar78) {
    fVar78 = fVar148;
  }
  fVar148 = 0.0;
  if (0.0 <= fVar78) {
    fVar148 = fVar78;
  }
  fVar107 = fVar107 - fVar148;
  local_340 = (ulong)uVar75;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar75 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)fVar148 * 0x38;
  lVar21 = *(long *)(_Var20 + lVar70);
  lVar22 = *(long *)(_Var20 + 0x10 + lVar70);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar62);
  fVar148 = *pfVar3;
  fVar78 = pfVar3[1];
  fVar108 = pfVar3[2];
  fVar109 = pfVar3[3];
  lVar24 = uVar62 + 1;
  pfVar3 = (float *)(lVar21 + lVar22 * lVar24);
  lVar1 = uVar62 + 2;
  pfVar4 = (float *)(lVar21 + lVar22 * lVar1);
  lVar2 = uVar62 + 3;
  pfVar5 = (float *)(lVar21 + lVar22 * lVar2);
  fVar128 = *pfVar5;
  fVar129 = pfVar5[1];
  fVar130 = pfVar5[2];
  fVar147 = pfVar5[3];
  lVar21 = *(long *)&pGVar19[4].fnumTimeSegments;
  lVar22 = *(long *)(lVar21 + lVar70);
  lVar23 = *(long *)(lVar21 + 0x10 + lVar70);
  pfVar5 = (float *)(lVar22 + lVar23 * uVar62);
  fVar149 = *pfVar5;
  fVar165 = pfVar5[1];
  fVar166 = pfVar5[2];
  fVar167 = pfVar5[3];
  pfVar5 = (float *)(lVar22 + lVar23 * lVar24);
  pfVar6 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar7 = (float *)(lVar22 + lVar23 * lVar2);
  fVar170 = *pfVar7;
  fVar171 = pfVar7[1];
  fVar172 = pfVar7[2];
  fVar195 = pfVar7[3];
  fVar197 = *pfVar4 * 0.0;
  fVar208 = pfVar4[1] * 0.0;
  fVar218 = pfVar4[2] * 0.0;
  fVar240 = pfVar4[3] * 0.0;
  fVar196 = fVar128 * 0.0 + fVar197;
  fVar207 = fVar129 * 0.0 + fVar208;
  fVar209 = fVar130 * 0.0 + fVar218;
  fVar219 = fVar147 * 0.0 + fVar240;
  fVar313 = *pfVar3 * 0.0;
  fVar320 = pfVar3[1] * 0.0;
  fVar322 = pfVar3[2] * 0.0;
  fVar279 = pfVar3[3] * 0.0;
  fVar275 = fVar313 + fVar196 + fVar148;
  fVar283 = fVar320 + fVar207 + fVar78;
  fVar293 = fVar322 + fVar209 + fVar108;
  fVar295 = fVar279 + fVar219 + fVar109;
  fVar196 = (*pfVar3 * 3.0 + fVar196) - fVar148 * 3.0;
  fVar207 = (pfVar3[1] * 3.0 + fVar207) - fVar78 * 3.0;
  fVar209 = (pfVar3[2] * 3.0 + fVar209) - fVar108 * 3.0;
  fVar219 = (pfVar3[3] * 3.0 + fVar219) - fVar109 * 3.0;
  fVar316 = *pfVar6 * 0.0;
  fVar321 = pfVar6[1] * 0.0;
  fVar276 = pfVar6[2] * 0.0;
  fVar280 = pfVar6[3] * 0.0;
  fVar253 = fVar170 * 0.0 + fVar316;
  fVar256 = fVar171 * 0.0 + fVar321;
  fVar315 = fVar172 * 0.0 + fVar276;
  fVar224 = fVar195 * 0.0 + fVar280;
  fVar284 = *pfVar5 * 0.0;
  fVar294 = pfVar5[1] * 0.0;
  fVar296 = pfVar5[2] * 0.0;
  fVar298 = pfVar5[3] * 0.0;
  fVar300 = fVar284 + fVar253 + fVar149;
  fVar310 = fVar294 + fVar256 + fVar165;
  fVar312 = fVar296 + fVar315 + fVar166;
  fVar314 = fVar298 + fVar224 + fVar167;
  fVar297 = (*pfVar5 * 3.0 + fVar253) - fVar149 * 3.0;
  fVar299 = (pfVar5[1] * 3.0 + fVar256) - fVar165 * 3.0;
  fVar309 = (pfVar5[2] * 3.0 + fVar315) - fVar166 * 3.0;
  fVar311 = (pfVar5[3] * 3.0 + fVar224) - fVar167 * 3.0;
  fVar235 = fVar197 + fVar128 + fVar313 + fVar148 * 0.0;
  fVar237 = fVar208 + fVar129 + fVar320 + fVar78 * 0.0;
  fVar261 = fVar218 + fVar130 + fVar322 + fVar108 * 0.0;
  fVar272 = fVar240 + fVar147 + fVar279 + fVar109 * 0.0;
  fVar253 = ((fVar128 * 3.0 - *pfVar4 * 3.0) + fVar313) - fVar148 * 0.0;
  fVar256 = ((fVar129 * 3.0 - pfVar4[1] * 3.0) + fVar320) - fVar78 * 0.0;
  fVar315 = ((fVar130 * 3.0 - pfVar4[2] * 3.0) + fVar322) - fVar108 * 0.0;
  fVar224 = ((fVar147 * 3.0 - pfVar4[3] * 3.0) + fVar279) - fVar109 * 0.0;
  fVar128 = fVar316 + fVar170 + fVar284 + fVar149 * 0.0;
  fVar129 = fVar321 + fVar171 + fVar294 + fVar165 * 0.0;
  fVar130 = fVar276 + fVar172 + fVar296 + fVar166 * 0.0;
  fVar197 = fVar280 + fVar195 + fVar298 + fVar167 * 0.0;
  fVar148 = ((fVar170 * 3.0 - *pfVar6 * 3.0) + fVar284) - fVar149 * 0.0;
  fVar78 = ((fVar171 * 3.0 - pfVar6[1] * 3.0) + fVar294) - fVar165 * 0.0;
  fVar108 = ((fVar172 * 3.0 - pfVar6[2] * 3.0) + fVar296) - fVar166 * 0.0;
  fVar109 = ((fVar195 * 3.0 - pfVar6[3] * 3.0) + fVar298) - fVar167 * 0.0;
  fVar208 = fVar207 * fVar300 - fVar310 * fVar196;
  fVar240 = fVar209 * fVar310 - fVar312 * fVar207;
  fVar313 = fVar196 * fVar312 - fVar300 * fVar209;
  fVar316 = fVar219 * fVar314 - fVar314 * fVar219;
  fVar170 = fVar207 * fVar297 - fVar299 * fVar196;
  fVar172 = fVar209 * fVar299 - fVar309 * fVar207;
  fVar195 = fVar196 * fVar309 - fVar297 * fVar209;
  fVar147 = fVar256 * fVar128 - fVar129 * fVar253;
  fVar165 = fVar315 * fVar129 - fVar130 * fVar256;
  fVar166 = fVar253 * fVar130 - fVar128 * fVar315;
  fVar167 = fVar224 * fVar197 - fVar197 * fVar224;
  fVar128 = fVar256 * fVar148 - fVar78 * fVar253;
  fVar129 = fVar315 * fVar78 - fVar108 * fVar256;
  fVar108 = fVar253 * fVar108 - fVar148 * fVar315;
  fVar197 = fVar313 * fVar313 + fVar240 * fVar240 + fVar208 * fVar208;
  auVar132 = ZEXT416((uint)fVar197);
  auVar79 = rsqrtss(ZEXT416((uint)fVar197),auVar132);
  fVar148 = auVar79._0_4_;
  fVar218 = fVar148 * 1.5 - fVar148 * fVar148 * fVar197 * 0.5 * fVar148;
  fVar297 = fVar208 * fVar170 + fVar313 * fVar195 + fVar240 * fVar172;
  fVar148 = fVar316 * fVar218;
  auVar79 = rcpss(auVar132,auVar132);
  fVar171 = (2.0 - fVar197 * auVar79._0_4_) * auVar79._0_4_;
  fVar299 = fVar166 * fVar166 + fVar165 * fVar165 + fVar147 * fVar147;
  auVar79 = ZEXT416((uint)fVar299);
  auVar132 = rsqrtss(ZEXT416((uint)fVar299),auVar79);
  fVar78 = auVar132._0_4_;
  fVar149 = fVar78 * 1.5 - fVar78 * fVar78 * fVar299 * 0.5 * fVar78;
  fVar309 = fVar147 * fVar128 + fVar166 * fVar108 + fVar165 * fVar129;
  fVar130 = fVar167 * fVar149;
  auVar79 = rcpss(auVar79,auVar79);
  fVar78 = (2.0 - fVar299 * auVar79._0_4_) * auVar79._0_4_;
  fVar300 = fVar295 * fVar240 * fVar218;
  fVar314 = fVar295 * fVar313 * fVar218;
  fVar220 = fVar295 * fVar208 * fVar218;
  fVar222 = fVar295 * fVar148;
  fVar262 = fVar275 - fVar300;
  fVar273 = fVar283 - fVar314;
  fVar277 = fVar293 - fVar220;
  fVar281 = fVar295 - fVar222;
  fVar241 = fVar295 * fVar171 * (fVar197 * fVar172 - fVar297 * fVar240) * fVar218 +
            fVar219 * fVar240 * fVar218;
  fVar254 = fVar295 * fVar171 * (fVar197 * fVar195 - fVar297 * fVar313) * fVar218 +
            fVar219 * fVar313 * fVar218;
  fVar257 = fVar295 * fVar171 * (fVar197 * fVar170 - fVar297 * fVar208) * fVar218 +
            fVar219 * fVar208 * fVar218;
  fVar259 = fVar295 * fVar171 * (fVar197 * (fVar219 * fVar311 - fVar311 * fVar219) -
                                fVar297 * fVar316) * fVar218 + fVar219 * fVar148;
  fVar300 = fVar300 + fVar275;
  fVar314 = fVar314 + fVar283;
  fVar220 = fVar220 + fVar293;
  fVar222 = fVar222 + fVar295;
  fVar197 = fVar272 * fVar165 * fVar149;
  fVar208 = fVar272 * fVar166 * fVar149;
  fVar218 = fVar272 * fVar147 * fVar149;
  fVar240 = fVar272 * fVar130;
  fVar313 = fVar235 - fVar197;
  fVar321 = fVar237 - fVar208;
  fVar279 = fVar261 - fVar218;
  fVar294 = fVar272 - fVar240;
  fVar275 = fVar272 * fVar78 * (fVar299 * fVar129 - fVar309 * fVar165) * fVar149 +
            fVar224 * fVar165 * fVar149;
  fVar293 = fVar272 * fVar78 * (fVar299 * fVar108 - fVar309 * fVar166) * fVar149 +
            fVar224 * fVar166 * fVar149;
  fVar297 = fVar272 * fVar78 * (fVar299 * fVar128 - fVar309 * fVar147) * fVar149 +
            fVar224 * fVar147 * fVar149;
  fVar309 = fVar272 * fVar78 * (fVar299 * (fVar224 * fVar109 - fVar109 * fVar224) -
                               fVar309 * fVar167) * fVar149 + fVar224 * fVar130;
  fVar197 = fVar197 + fVar235;
  fVar208 = fVar208 + fVar237;
  fVar218 = fVar218 + fVar261;
  fVar240 = fVar240 + fVar272;
  lVar22 = *(long *)(_Var20 + 0x38 + lVar70);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar70);
  pfVar3 = (float *)(lVar22 + lVar23 * uVar62);
  fVar148 = *pfVar3;
  fVar78 = pfVar3[1];
  fVar108 = pfVar3[2];
  fVar109 = pfVar3[3];
  pfVar3 = (float *)(lVar22 + lVar23 * lVar24);
  pfVar4 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar5 = (float *)(lVar22 + lVar23 * lVar2);
  fVar128 = *pfVar5;
  fVar129 = pfVar5[1];
  fVar130 = pfVar5[2];
  fVar147 = pfVar5[3];
  lVar22 = *(long *)(lVar21 + 0x38 + lVar70);
  lVar21 = *(long *)(lVar21 + 0x48 + lVar70);
  pRVar66 = (RTCIntersectArguments *)(lVar24 * lVar21);
  pfVar5 = (float *)(lVar22 + lVar21 * lVar2);
  fVar149 = *pfVar5;
  fVar165 = pfVar5[1];
  fVar166 = pfVar5[2];
  fVar167 = pfVar5[3];
  fVar283 = *pfVar4 * 0.0;
  fVar295 = pfVar4[1] * 0.0;
  fVar299 = pfVar4[2] * 0.0;
  fVar311 = pfVar4[3] * 0.0;
  fVar320 = fVar128 * 0.0 + fVar283;
  fVar276 = fVar129 * 0.0 + fVar295;
  fVar284 = fVar130 * 0.0 + fVar299;
  fVar298 = fVar147 * 0.0 + fVar311;
  fVar316 = *pfVar3 * 0.0;
  fVar322 = pfVar3[1] * 0.0;
  fVar280 = pfVar3[2] * 0.0;
  fVar296 = pfVar3[3] * 0.0;
  fVar235 = (*pfVar3 * 3.0 + fVar320) - fVar148 * 3.0;
  fVar237 = (pfVar3[1] * 3.0 + fVar276) - fVar78 * 3.0;
  fVar261 = (pfVar3[2] * 3.0 + fVar284) - fVar108 * 3.0;
  fVar272 = (pfVar3[3] * 3.0 + fVar298) - fVar109 * 3.0;
  pfVar3 = (float *)(lVar22 + lVar1 * lVar21);
  fVar242 = *pfVar3 * 0.0;
  fVar255 = pfVar3[1] * 0.0;
  fVar258 = pfVar3[2] * 0.0;
  fVar260 = pfVar3[3] * 0.0;
  fVar225 = fVar149 * 0.0 + fVar242;
  fVar236 = fVar165 * 0.0 + fVar255;
  fVar238 = fVar166 * 0.0 + fVar258;
  fVar239 = fVar167 * 0.0 + fVar260;
  pfVar5 = (float *)((long)&pRVar66->flags + lVar22);
  fVar263 = *pfVar5 * 0.0;
  fVar274 = pfVar5[1] * 0.0;
  fVar278 = pfVar5[2] * 0.0;
  fVar282 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar22 + uVar62 * lVar21);
  fVar170 = *pfVar6;
  fVar171 = pfVar6[1];
  fVar172 = pfVar6[2];
  fVar195 = pfVar6[3];
  fVar310 = (*pfVar5 * 3.0 + fVar225) - fVar170 * 3.0;
  fVar312 = (pfVar5[1] * 3.0 + fVar236) - fVar171 * 3.0;
  fVar221 = (pfVar5[2] * 3.0 + fVar238) - fVar172 * 3.0;
  fVar223 = (pfVar5[3] * 3.0 + fVar239) - fVar195 * 3.0;
  fVar320 = fVar316 + fVar320 + fVar148;
  fVar276 = fVar322 + fVar276 + fVar78;
  fVar284 = fVar280 + fVar284 + fVar108;
  fVar298 = fVar296 + fVar298 + fVar109;
  fVar283 = fVar283 + fVar128 + fVar316 + fVar148 * 0.0;
  fVar295 = fVar295 + fVar129 + fVar322 + fVar78 * 0.0;
  fVar299 = fVar299 + fVar130 + fVar280 + fVar108 * 0.0;
  fVar311 = fVar311 + fVar147 + fVar296 + fVar109 * 0.0;
  fVar148 = ((fVar128 * 3.0 - *pfVar4 * 3.0) + fVar316) - fVar148 * 0.0;
  fVar78 = ((fVar129 * 3.0 - pfVar4[1] * 3.0) + fVar322) - fVar78 * 0.0;
  fVar108 = ((fVar130 * 3.0 - pfVar4[2] * 3.0) + fVar280) - fVar108 * 0.0;
  fVar109 = ((fVar147 * 3.0 - pfVar4[3] * 3.0) + fVar296) - fVar109 * 0.0;
  fVar147 = fVar263 + fVar225 + fVar170;
  fVar225 = fVar274 + fVar236 + fVar171;
  fVar236 = fVar278 + fVar238 + fVar172;
  fVar238 = fVar282 + fVar239 + fVar195;
  fVar316 = fVar242 + fVar149 + fVar263 + fVar170 * 0.0;
  fVar322 = fVar255 + fVar165 + fVar274 + fVar171 * 0.0;
  fVar280 = fVar258 + fVar166 + fVar278 + fVar172 * 0.0;
  fVar296 = fVar260 + fVar167 + fVar282 + fVar195 * 0.0;
  fVar128 = ((fVar149 * 3.0 - *pfVar3 * 3.0) + fVar263) - fVar170 * 0.0;
  fVar129 = ((fVar165 * 3.0 - pfVar3[1] * 3.0) + fVar274) - fVar171 * 0.0;
  fVar130 = ((fVar166 * 3.0 - pfVar3[2] * 3.0) + fVar278) - fVar172 * 0.0;
  fVar167 = ((fVar167 * 3.0 - pfVar3[3] * 3.0) + fVar282) - fVar195 * 0.0;
  fVar166 = fVar237 * fVar147 - fVar225 * fVar235;
  fVar170 = fVar261 * fVar225 - fVar236 * fVar237;
  fVar236 = fVar235 * fVar236 - fVar147 * fVar261;
  fVar239 = fVar272 * fVar238 - fVar238 * fVar272;
  fVar147 = fVar237 * fVar310 - fVar312 * fVar235;
  fVar149 = fVar261 * fVar312 - fVar221 * fVar237;
  fVar165 = fVar235 * fVar221 - fVar310 * fVar261;
  fVar310 = fVar78 * fVar316 - fVar322 * fVar148;
  fVar221 = fVar108 * fVar322 - fVar280 * fVar78;
  fVar225 = fVar148 * fVar280 - fVar316 * fVar108;
  fVar238 = fVar109 * fVar296 - fVar296 * fVar109;
  fVar171 = fVar78 * fVar128 - fVar129 * fVar148;
  fVar195 = fVar108 * fVar129 - fVar130 * fVar78;
  fVar322 = fVar148 * fVar130 - fVar128 * fVar108;
  fVar128 = fVar236 * fVar236 + fVar170 * fVar170 + fVar166 * fVar166;
  auVar79 = ZEXT416((uint)fVar128);
  auVar132 = rsqrtss(ZEXT416((uint)fVar128),auVar79);
  fVar129 = auVar132._0_4_;
  fVar312 = fVar129 * 1.5 - fVar129 * fVar129 * fVar128 * 0.5 * fVar129;
  fVar260 = fVar166 * fVar147 + fVar236 * fVar165 + fVar170 * fVar149;
  auVar79 = rcpss(auVar79,auVar79);
  fVar129 = (2.0 - fVar128 * auVar79._0_4_) * auVar79._0_4_;
  fVar130 = fVar239 * fVar312;
  fVar242 = fVar225 * fVar225 + fVar221 * fVar221 + fVar310 * fVar310;
  auVar79 = ZEXT416((uint)fVar242);
  auVar132 = rsqrtss(ZEXT416((uint)fVar242),auVar79);
  fVar172 = auVar132._0_4_;
  fVar258 = fVar172 * 1.5 - fVar172 * fVar172 * fVar242 * 0.5 * fVar172;
  fVar263 = fVar310 * fVar171 + fVar225 * fVar322 + fVar221 * fVar195;
  auVar79 = rcpss(auVar79,auVar79);
  fVar274 = (2.0 - fVar242 * auVar79._0_4_) * auVar79._0_4_;
  fVar255 = fVar238 * fVar258;
  fVar172 = fVar298 * fVar170 * fVar312;
  fVar316 = fVar298 * fVar236 * fVar312;
  fVar280 = fVar298 * fVar166 * fVar312;
  fVar296 = fVar298 * fVar130;
  fVar149 = fVar298 * fVar129 * (fVar128 * fVar149 - fVar260 * fVar170) * fVar312 +
            fVar272 * fVar170 * fVar312;
  fVar165 = fVar298 * fVar129 * (fVar128 * fVar165 - fVar260 * fVar236) * fVar312 +
            fVar272 * fVar236 * fVar312;
  fVar166 = fVar298 * fVar129 * (fVar128 * fVar147 - fVar260 * fVar166) * fVar312 +
            fVar272 * fVar166 * fVar312;
  fVar170 = fVar298 * fVar129 * (fVar128 * (fVar272 * fVar223 - fVar223 * fVar272) -
                                fVar260 * fVar239) * fVar312 + fVar272 * fVar130;
  fVar312 = fVar320 - fVar172;
  fVar223 = fVar276 - fVar316;
  fVar236 = fVar284 - fVar280;
  fVar239 = fVar298 - fVar296;
  fVar172 = fVar172 + fVar320;
  fVar316 = fVar316 + fVar276;
  fVar280 = fVar280 + fVar284;
  fVar296 = fVar296 + fVar298;
  fVar128 = fVar311 * fVar221 * fVar258;
  fVar129 = fVar311 * fVar225 * fVar258;
  fVar130 = fVar311 * fVar310 * fVar258;
  fVar147 = fVar311 * fVar255;
  fVar276 = fVar311 * fVar274 * (fVar242 * fVar195 - fVar263 * fVar221) * fVar258 +
            fVar109 * fVar221 * fVar258;
  fVar322 = fVar311 * fVar274 * (fVar242 * fVar322 - fVar263 * fVar225) * fVar258 +
            fVar109 * fVar225 * fVar258;
  fVar284 = fVar311 * fVar274 * (fVar242 * fVar171 - fVar263 * fVar310) * fVar258 +
            fVar109 * fVar310 * fVar258;
  fVar298 = fVar311 * fVar274 * (fVar242 * (fVar109 * fVar167 - fVar167 * fVar109) -
                                fVar263 * fVar238) * fVar258 + fVar109 * fVar255;
  fVar167 = fVar283 - fVar128;
  fVar171 = fVar295 - fVar129;
  fVar195 = fVar299 - fVar130;
  fVar320 = fVar311 - fVar147;
  fVar128 = fVar128 + fVar283;
  fVar129 = fVar129 + fVar295;
  fVar130 = fVar130 + fVar299;
  fVar147 = fVar147 + fVar311;
  fVar283 = 1.0 - fVar107;
  local_378 = fVar262 * fVar283 + fVar312 * fVar107;
  fStack_374 = fVar273 * fVar283 + fVar223 * fVar107;
  fStack_370 = fVar277 * fVar283 + fVar236 * fVar107;
  fStack_36c = fVar281 * fVar283 + fVar239 * fVar107;
  local_388 = ((fVar196 - fVar241) * 0.33333334 + fVar262) * fVar283 +
              ((fVar235 - fVar149) * 0.33333334 + fVar312) * fVar107;
  fStack_384 = ((fVar207 - fVar254) * 0.33333334 + fVar273) * fVar283 +
               ((fVar237 - fVar165) * 0.33333334 + fVar223) * fVar107;
  fStack_380 = ((fVar209 - fVar257) * 0.33333334 + fVar277) * fVar283 +
               ((fVar261 - fVar166) * 0.33333334 + fVar236) * fVar107;
  fStack_37c = ((fVar219 - fVar259) * 0.33333334 + fVar281) * fVar283 +
               ((fVar272 - fVar170) * 0.33333334 + fVar239) * fVar107;
  local_3a8 = (fVar313 - (fVar253 - fVar275) * 0.33333334) * fVar283 +
              (fVar167 - (fVar148 - fVar276) * 0.33333334) * fVar107;
  fStack_3a4 = (fVar321 - (fVar256 - fVar293) * 0.33333334) * fVar283 +
               (fVar171 - (fVar78 - fVar322) * 0.33333334) * fVar107;
  fStack_3a0 = (fVar279 - (fVar315 - fVar297) * 0.33333334) * fVar283 +
               (fVar195 - (fVar108 - fVar284) * 0.33333334) * fVar107;
  fStack_39c = (fVar294 - (fVar224 - fVar309) * 0.33333334) * fVar283 +
               (fVar320 - (fVar109 - fVar298) * 0.33333334) * fVar107;
  local_398 = fVar313 * fVar283 + fVar167 * fVar107;
  fStack_394 = fVar321 * fVar283 + fVar171 * fVar107;
  fStack_390 = fVar279 * fVar283 + fVar195 * fVar107;
  fStack_38c = fVar294 * fVar283 + fVar320 * fVar107;
  local_368 = fVar300 * fVar283 + fVar172 * fVar107;
  fStack_364 = fVar314 * fVar283 + fVar316 * fVar107;
  fStack_360 = fVar220 * fVar283 + fVar280 * fVar107;
  fStack_35c = fVar222 * fVar283 + fVar296 * fVar107;
  local_3c8 = ((fVar241 + fVar196) * 0.33333334 + fVar300) * fVar283 +
              ((fVar149 + fVar235) * 0.33333334 + fVar172) * fVar107;
  fStack_3c4 = ((fVar254 + fVar207) * 0.33333334 + fVar314) * fVar283 +
               ((fVar165 + fVar237) * 0.33333334 + fVar316) * fVar107;
  fStack_3c0 = ((fVar257 + fVar209) * 0.33333334 + fVar220) * fVar283 +
               ((fVar166 + fVar261) * 0.33333334 + fVar280) * fVar107;
  fStack_3bc = ((fVar259 + fVar219) * 0.33333334 + fVar222) * fVar283 +
               ((fVar170 + fVar272) * 0.33333334 + fVar296) * fVar107;
  local_3dc.m128[1] =
       (fVar197 - (fVar275 + fVar253) * 0.33333334) * fVar283 +
       (fVar128 - (fVar276 + fVar148) * 0.33333334) * fVar107;
  local_3dc.m128[2] =
       (fVar208 - (fVar293 + fVar256) * 0.33333334) * fVar283 +
       (fVar129 - (fVar322 + fVar78) * 0.33333334) * fVar107;
  local_3dc.m128[3] =
       (fVar218 - (fVar297 + fVar315) * 0.33333334) * fVar283 +
       (fVar130 - (fVar284 + fVar108) * 0.33333334) * fVar107;
  fStack_3cc = (fVar240 - (fVar309 + fVar224) * 0.33333334) * fVar283 +
               (fVar147 - (fVar298 + fVar109) * 0.33333334) * fVar107;
  local_2b8 = fVar283 * fVar197 + fVar107 * fVar128;
  fStack_2b4 = fVar283 * fVar208 + fVar107 * fVar129;
  fStack_2b0 = fVar283 * fVar218 + fVar107 * fVar130;
  fStack_2ac = fVar283 * fVar240 + fVar107 * fVar147;
  fVar148 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar78 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar107 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar108 = (pre->ray_space).vx.field_0.m128[0];
  fVar109 = (pre->ray_space).vx.field_0.m128[1];
  fVar128 = (pre->ray_space).vy.field_0.m128[0];
  fVar129 = (pre->ray_space).vy.field_0.m128[1];
  fVar130 = (pre->ray_space).vz.field_0.m128[0];
  fVar147 = (pre->ray_space).vz.field_0.m128[1];
  local_308 = (local_378 - fVar148) * fVar108 +
              (fStack_374 - fVar78) * fVar128 + (fStack_370 - fVar107) * fVar130;
  fStack_304 = (local_378 - fVar148) * fVar109 +
               (fStack_374 - fVar78) * fVar129 + (fStack_370 - fVar107) * fVar147;
  local_208 = CONCAT44(fStack_304,local_308);
  fVar166 = (local_388 - fVar148) * fVar108 +
            (fStack_384 - fVar78) * fVar128 + (fStack_380 - fVar107) * fVar130;
  fVar167 = (local_388 - fVar148) * fVar109 +
            (fStack_384 - fVar78) * fVar129 + (fStack_380 - fVar107) * fVar147;
  local_218 = CONCAT44(fVar167,fVar166);
  fVar149 = (local_3a8 - fVar148) * fVar108 +
            (fStack_3a4 - fVar78) * fVar128 + (fStack_3a0 - fVar107) * fVar130;
  fVar165 = (local_3a8 - fVar148) * fVar109 +
            (fStack_3a4 - fVar78) * fVar129 + (fStack_3a0 - fVar107) * fVar147;
  local_228 = CONCAT44(fVar165,fVar149);
  fVar170 = (local_398 - fVar148) * fVar108 +
            (fStack_394 - fVar78) * fVar128 + (fStack_390 - fVar107) * fVar130;
  fVar171 = (local_398 - fVar148) * fVar109 +
            (fStack_394 - fVar78) * fVar129 + (fStack_390 - fVar107) * fVar147;
  local_238 = CONCAT44(fVar171,fVar170);
  fStack_300 = (local_368 - fVar148) * fVar108 +
               (fStack_364 - fVar78) * fVar128 + (fStack_360 - fVar107) * fVar130;
  fStack_2fc = (local_368 - fVar148) * fVar109 +
               (fStack_364 - fVar78) * fVar129 + (fStack_360 - fVar107) * fVar147;
  fVar172 = (local_3c8 - fVar148) * fVar108 +
            (fStack_3c4 - fVar78) * fVar128 + (fStack_3c0 - fVar107) * fVar130;
  fVar195 = (local_3c8 - fVar148) * fVar109 +
            (fStack_3c4 - fVar78) * fVar129 + (fStack_3c0 - fVar107) * fVar147;
  local_258 = CONCAT44(fVar195,fVar172);
  fVar196 = (local_3dc.m128[1] - fVar148) * fVar108 +
            (local_3dc.m128[2] - fVar78) * fVar128 + (local_3dc.m128[3] - fVar107) * fVar130;
  fVar197 = (local_3dc.m128[1] - fVar148) * fVar109 +
            (local_3dc.m128[2] - fVar78) * fVar129 + (local_3dc.m128[3] - fVar107) * fVar147;
  local_268 = CONCAT44(fVar197,fVar196);
  fVar108 = (local_2b8 - fVar148) * fVar108 +
            (fStack_2b4 - fVar78) * fVar128 + (fStack_2b0 - fVar107) * fVar130;
  fVar78 = (local_2b8 - fVar148) * fVar109 +
           (fStack_2b4 - fVar78) * fVar129 + (fStack_2b0 - fVar107) * fVar147;
  local_278 = CONCAT44(fVar78,fVar108);
  register0x00001308 = local_258;
  local_318 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar99._8_4_ = fStack_300;
  auVar99._0_8_ = local_208;
  auVar99._12_4_ = fStack_2fc;
  auVar79 = minps(auVar99,_local_318);
  auVar121._8_4_ = fVar196;
  auVar121._0_8_ = local_228;
  auVar121._12_4_ = fVar197;
  auVar132 = minps(auVar121,_local_b8);
  auVar79 = minps(auVar79,auVar132);
  auVar122._4_4_ = fStack_304;
  auVar122._0_4_ = local_308;
  auVar122._8_4_ = fStack_300;
  auVar122._12_4_ = fStack_2fc;
  auVar132 = maxps(auVar122,_local_318);
  auVar133._4_4_ = fVar165;
  auVar133._0_4_ = fVar149;
  auVar133._8_4_ = fVar196;
  auVar133._12_4_ = fVar197;
  auVar134 = maxps(auVar133,_local_b8);
  auVar123 = maxps(auVar132,auVar134);
  auVar27._4_8_ = auVar134._8_8_;
  auVar27._0_4_ = auVar79._4_4_;
  auVar135._0_8_ = auVar27._0_8_ << 0x20;
  auVar135._8_4_ = auVar79._8_4_;
  auVar135._12_4_ = auVar79._12_4_;
  auVar136._8_8_ = auVar79._8_8_;
  auVar136._0_8_ = auVar135._8_8_;
  auVar132 = minps(auVar79,auVar136);
  auVar28._4_8_ = auVar79._8_8_;
  auVar28._0_4_ = auVar123._4_4_;
  auVar137._0_8_ = auVar28._0_8_ << 0x20;
  auVar137._8_4_ = auVar123._8_4_;
  auVar137._12_4_ = auVar123._12_4_;
  auVar138._8_8_ = auVar123._8_8_;
  auVar138._0_8_ = auVar137._8_8_;
  auVar79 = maxps(auVar123,auVar138);
  auVar100._0_8_ = auVar132._0_8_ & 0x7fffffff7fffffff;
  auVar100._8_4_ = auVar132._8_4_ & 0x7fffffff;
  auVar100._12_4_ = auVar132._12_4_ & 0x7fffffff;
  auVar124._0_8_ = auVar79._0_8_ & 0x7fffffff7fffffff;
  auVar124._8_4_ = auVar79._8_4_ & 0x7fffffff;
  auVar124._12_4_ = auVar79._12_4_ & 0x7fffffff;
  auVar79 = maxps(auVar100,auVar124);
  fVar148 = auVar79._4_4_;
  if (auVar79._4_4_ <= auVar79._0_4_) {
    fVar148 = auVar79._0_4_;
  }
  auVar69 = (undefined1  [8])((ulong)uVar72 + 0xf);
  fVar148 = fVar148 * 9.536743e-07;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  local_248 = CONCAT44(fStack_2fc,fStack_300);
  uStack_240 = CONCAT44(fStack_2fc,fStack_300);
  uStack_250 = local_258;
  uStack_260 = local_268;
  uStack_270 = local_278;
  local_148 = fVar148;
  fStack_144 = fVar148;
  fStack_140 = fVar148;
  fStack_13c = fVar148;
  local_158 = -fVar148;
  fStack_154 = -fVar148;
  fStack_150 = -fVar148;
  fStack_14c = -fVar148;
  local_88 = fVar166 - local_308;
  fStack_84 = fVar167 - fStack_304;
  fStack_80 = fVar172 - fStack_300;
  fStack_7c = fVar195 - fStack_2fc;
  local_98 = fVar149 - fVar166;
  fStack_94 = fVar165 - fVar167;
  fStack_90 = fVar196 - fVar172;
  fStack_8c = fVar197 - fVar195;
  local_a8 = fVar170 - fVar149;
  fStack_a4 = fVar171 - fVar165;
  fStack_a0 = fVar108 - fVar196;
  fStack_9c = fVar78 - fVar197;
  local_178 = local_368 - local_378;
  fStack_174 = fStack_364 - fStack_374;
  fStack_170 = fStack_360 - fStack_370;
  fStack_16c = fStack_35c - fStack_36c;
  local_188 = local_3c8 - local_388;
  fStack_184 = fStack_3c4 - fStack_384;
  fStack_180 = fStack_3c0 - fStack_380;
  fStack_17c = fStack_3bc - fStack_37c;
  local_198 = local_3dc.m128[1] - local_3a8;
  fStack_194 = local_3dc.m128[2] - fStack_3a4;
  fStack_190 = local_3dc.m128[3] - fStack_3a0;
  fStack_18c = fStack_3cc - fStack_39c;
  local_1a8 = local_2b8 - local_398;
  fStack_1a4 = fStack_2b4 - fStack_394;
  fStack_1a0 = fStack_2b0 - fStack_390;
  fStack_19c = fStack_2ac - fStack_38c;
  uVar62 = 0;
  local_418 = 0x3f80000000000000;
  local_358 = 0x3f80000000000000;
  uStack_350 = 0;
  local_328 = local_228;
  uStack_320 = local_268;
  do {
    fVar78 = 1.0 - (float)local_418;
    fVar107 = 1.0 - (float)local_418;
    fVar108 = 1.0 - local_418._4_4_;
    fVar109 = 1.0 - local_418._4_4_;
    fVar128 = (float)local_208 * fVar78 + (float)local_248 * (float)local_418;
    fVar170 = local_208._4_4_ * fVar107 + local_248._4_4_ * (float)local_418;
    fVar171 = (float)uStack_200 * fVar108 + (float)uStack_240 * local_418._4_4_;
    fVar172 = uStack_200._4_4_ * fVar109 + uStack_240._4_4_ * local_418._4_4_;
    fVar165 = (float)local_218 * fVar78 + (float)local_258 * (float)local_418;
    fVar208 = local_218._4_4_ * fVar107 + local_258._4_4_ * (float)local_418;
    fVar209 = (float)uStack_210 * fVar108 + (float)uStack_250 * local_418._4_4_;
    fVar218 = uStack_210._4_4_ * fVar109 + uStack_250._4_4_ * local_418._4_4_;
    fVar219 = (float)local_228 * fVar78 + (float)local_268 * (float)local_418;
    fVar240 = local_228._4_4_ * fVar107 + local_268._4_4_ * (float)local_418;
    fVar253 = (float)uStack_220 * fVar108 + (float)uStack_260 * local_418._4_4_;
    fVar256 = uStack_220._4_4_ * fVar109 + uStack_260._4_4_ * local_418._4_4_;
    fVar293 = fVar78 * (float)local_238 + (float)local_418 * (float)local_278;
    fVar295 = fVar107 * local_238._4_4_ + (float)local_418 * local_278._4_4_;
    fVar297 = fVar108 * (float)uStack_230 + local_418._4_4_ * (float)uStack_270;
    fVar299 = fVar109 * uStack_230._4_4_ + local_418._4_4_ * uStack_270._4_4_;
    fVar78 = (local_358._4_4_ - (float)local_358) * 0.11111111;
    fVar315 = (local_358._4_4_ - (float)local_358) * 0.0 + (float)local_358;
    fVar224 = (local_358._4_4_ - (float)local_358) * 0.33333334 + (float)local_358;
    fVar235 = (local_358._4_4_ - (float)local_358) * 0.6666667 + (float)local_358;
    fVar237 = (local_358._4_4_ - (float)local_358) * 1.0 + (float)local_358;
    fVar261 = 1.0 - fVar315;
    fVar272 = 1.0 - fVar224;
    fVar275 = 1.0 - fVar235;
    fVar283 = 1.0 - fVar237;
    fVar129 = fVar165 * fVar261 + fVar219 * fVar315;
    fVar130 = fVar165 * fVar272 + fVar219 * fVar224;
    fVar147 = fVar165 * fVar275 + fVar219 * fVar235;
    fVar149 = fVar165 * fVar283 + fVar219 * fVar237;
    fVar195 = fVar208 * fVar261 + fVar240 * fVar315;
    fVar196 = fVar208 * fVar272 + fVar240 * fVar224;
    fVar197 = fVar208 * fVar275 + fVar240 * fVar235;
    fVar207 = fVar208 * fVar283 + fVar240 * fVar237;
    fVar107 = (fVar128 * fVar261 + fVar165 * fVar315) * fVar261 + fVar315 * fVar129;
    fVar108 = (fVar128 * fVar272 + fVar165 * fVar224) * fVar272 + fVar224 * fVar130;
    fVar109 = (fVar128 * fVar275 + fVar165 * fVar235) * fVar275 + fVar235 * fVar147;
    fVar128 = (fVar128 * fVar283 + fVar165 * fVar237) * fVar283 + fVar237 * fVar149;
    fVar165 = (fVar170 * fVar261 + fVar208 * fVar315) * fVar261 + fVar315 * fVar195;
    fVar166 = (fVar170 * fVar272 + fVar208 * fVar224) * fVar272 + fVar224 * fVar196;
    fVar167 = (fVar170 * fVar275 + fVar208 * fVar235) * fVar275 + fVar235 * fVar197;
    fVar170 = (fVar170 * fVar283 + fVar208 * fVar237) * fVar283 + fVar237 * fVar207;
    fVar129 = fVar129 * fVar261 + (fVar219 * fVar261 + fVar293 * fVar315) * fVar315;
    fVar130 = fVar130 * fVar272 + (fVar219 * fVar272 + fVar293 * fVar224) * fVar224;
    fVar147 = fVar147 * fVar275 + (fVar219 * fVar275 + fVar293 * fVar235) * fVar235;
    fVar149 = fVar149 * fVar283 + (fVar219 * fVar283 + fVar293 * fVar237) * fVar237;
    fVar195 = fVar195 * fVar261 + (fVar240 * fVar261 + fVar295 * fVar315) * fVar315;
    fVar196 = fVar196 * fVar272 + (fVar240 * fVar272 + fVar295 * fVar224) * fVar224;
    fVar197 = fVar197 * fVar275 + (fVar240 * fVar275 + fVar295 * fVar235) * fVar235;
    fVar207 = fVar207 * fVar283 + (fVar240 * fVar283 + fVar295 * fVar237) * fVar237;
    local_2a8 = fVar261 * fVar107 + fVar315 * fVar129;
    fStack_2a4 = fVar272 * fVar108 + fVar224 * fVar130;
    fStack_2a0 = fVar275 * fVar109 + fVar235 * fVar147;
    fStack_29c = fVar283 * fVar128 + fVar237 * fVar149;
    local_298 = fVar261 * fVar165 + fVar315 * fVar195;
    fStack_294 = fVar272 * fVar166 + fVar224 * fVar196;
    fStack_290 = fVar275 * fVar167 + fVar235 * fVar197;
    fStack_28c = fVar283 * fVar170 + fVar237 * fVar207;
    fVar130 = (fVar130 - fVar108) * 3.0 * fVar78;
    fVar109 = (fVar147 - fVar109) * 3.0 * fVar78;
    fVar128 = (fVar149 - fVar128) * 3.0 * fVar78;
    fVar147 = (fVar196 - fVar166) * 3.0 * fVar78;
    fVar149 = (fVar197 - fVar167) * 3.0 * fVar78;
    fVar166 = (fVar207 - fVar170) * 3.0 * fVar78;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_3b8._0_4_ = local_2a8 + (fVar129 - fVar107) * 3.0 * fVar78;
    local_3b8._4_4_ = fStack_2a4 + fVar130;
    uStack_3b0._0_4_ = fStack_2a0 + fVar109;
    uStack_3b0._4_4_ = fStack_29c + fVar128;
    fVar107 = local_298 + (fVar195 - fVar165) * 3.0 * fVar78;
    fVar108 = fStack_294 + fVar147;
    fStack_420 = fStack_290 + fVar149;
    fStack_41c = fStack_28c + fVar166;
    local_288._0_4_ = fStack_2a4 - fVar130;
    local_288._4_4_ = fStack_2a0 - fVar109;
    local_288._8_4_ = fStack_29c - fVar128;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar147;
    local_d8._4_4_ = fStack_290 - fVar149;
    local_d8._8_4_ = fStack_28c - fVar166;
    local_d8._12_4_ = 0;
    fVar109 = fVar209 * fVar261 + fVar253 * fVar315;
    fVar128 = fVar209 * fVar272 + fVar253 * fVar224;
    fVar129 = fVar209 * fVar275 + fVar253 * fVar235;
    fVar130 = fVar209 * fVar283 + fVar253 * fVar237;
    fVar147 = fVar218 * fVar261 + fVar256 * fVar315;
    fVar149 = fVar218 * fVar272 + fVar256 * fVar224;
    fVar165 = fVar218 * fVar275 + fVar256 * fVar235;
    fVar166 = fVar218 * fVar283 + fVar256 * fVar237;
    fVar195 = (fVar171 * fVar261 + fVar209 * fVar315) * fVar261 + fVar315 * fVar109;
    fVar196 = (fVar171 * fVar272 + fVar209 * fVar224) * fVar272 + fVar224 * fVar128;
    fVar197 = (fVar171 * fVar275 + fVar209 * fVar235) * fVar275 + fVar235 * fVar129;
    fVar207 = (fVar171 * fVar283 + fVar209 * fVar237) * fVar283 + fVar237 * fVar130;
    fVar167 = (fVar172 * fVar261 + fVar218 * fVar315) * fVar261 + fVar315 * fVar147;
    fVar170 = (fVar172 * fVar272 + fVar218 * fVar224) * fVar272 + fVar224 * fVar149;
    fVar171 = (fVar172 * fVar275 + fVar218 * fVar235) * fVar275 + fVar235 * fVar165;
    fVar172 = (fVar172 * fVar283 + fVar218 * fVar237) * fVar283 + fVar237 * fVar166;
    fVar109 = fVar109 * fVar261 + (fVar253 * fVar261 + fVar297 * fVar315) * fVar315;
    fVar128 = fVar128 * fVar272 + (fVar253 * fVar272 + fVar297 * fVar224) * fVar224;
    fVar129 = fVar129 * fVar275 + (fVar253 * fVar275 + fVar297 * fVar235) * fVar235;
    fVar130 = fVar130 * fVar283 + (fVar253 * fVar283 + fVar297 * fVar237) * fVar237;
    fVar208 = fVar147 * fVar261 + (fVar256 * fVar261 + fVar299 * fVar315) * fVar315;
    fVar209 = fVar149 * fVar272 + (fVar256 * fVar272 + fVar299 * fVar224) * fVar224;
    fVar218 = fVar165 * fVar275 + (fVar256 * fVar275 + fVar299 * fVar235) * fVar235;
    fVar219 = fVar166 * fVar283 + (fVar256 * fVar283 + fVar299 * fVar237) * fVar237;
    fVar147 = fVar261 * fVar195 + fVar315 * fVar109;
    fVar149 = fVar272 * fVar196 + fVar224 * fVar128;
    fVar165 = fVar275 * fVar197 + fVar235 * fVar129;
    fVar166 = fVar283 * fVar207 + fVar237 * fVar130;
    fVar240 = fVar261 * fVar167 + fVar315 * fVar208;
    fVar253 = fVar272 * fVar170 + fVar224 * fVar209;
    fVar256 = fVar275 * fVar171 + fVar235 * fVar218;
    fVar315 = fVar283 * fVar172 + fVar237 * fVar219;
    fVar128 = (fVar128 - fVar196) * 3.0 * fVar78;
    fVar129 = (fVar129 - fVar197) * 3.0 * fVar78;
    fVar130 = (fVar130 - fVar207) * 3.0 * fVar78;
    fVar170 = (fVar209 - fVar170) * 3.0 * fVar78;
    fVar171 = (fVar218 - fVar171) * 3.0 * fVar78;
    fVar172 = (fVar219 - fVar172) * 3.0 * fVar78;
    local_f8._4_4_ = fVar165;
    local_f8._0_4_ = fVar149;
    local_f8._8_4_ = fVar166;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar256;
    local_118._0_4_ = fVar253;
    local_118._8_4_ = fVar315;
    local_118._12_4_ = 0;
    local_338 = fVar147 + (fVar109 - fVar195) * 3.0 * fVar78;
    fStack_334 = fVar149 + fVar128;
    fStack_330 = fVar165 + fVar129;
    fStack_32c = fVar166 + fVar130;
    local_108 = fVar240 + (fVar208 - fVar167) * 3.0 * fVar78;
    fStack_104 = fVar253 + fVar170;
    fStack_100 = fVar256 + fVar171;
    fStack_fc = fVar315 + fVar172;
    local_138._0_4_ = fVar149 - fVar128;
    local_138._4_4_ = fVar165 - fVar129;
    local_138._8_4_ = fVar166 - fVar130;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar253 - fVar170;
    local_128._4_4_ = fVar256 - fVar171;
    local_128._8_4_ = fVar315 - fVar172;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar130 = (fVar149 - fStack_2a4) + (fVar147 - local_2a8);
    fVar167 = (fVar165 - fStack_2a0) + (fVar149 - fStack_2a4);
    fVar170 = (fVar166 - fStack_29c) + (fVar165 - fStack_2a0);
    fVar171 = (fVar166 - fStack_29c) + 0.0;
    fVar78 = (fVar253 - fStack_294) + (fVar240 - local_298);
    fVar109 = (fVar256 - fStack_290) + (fVar253 - fStack_294);
    fVar128 = (fVar315 - fStack_28c) + (fVar256 - fStack_290);
    fVar129 = (fVar315 - fStack_28c) + 0.0;
    auVar189._0_8_ =
         CONCAT44(fStack_294 * fVar167 - fStack_2a4 * fVar109,
                  local_298 * fVar130 - local_2a8 * fVar78);
    auVar189._8_4_ = fStack_290 * fVar170 - fStack_2a0 * fVar128;
    auVar189._12_4_ = fStack_28c * fVar171 - fStack_29c * fVar129;
    auVar139._0_4_ = fVar107 * fVar130 - (float)local_3b8._0_4_ * fVar78;
    auVar139._4_4_ = fVar108 * fVar167 - (float)local_3b8._4_4_ * fVar109;
    auVar139._8_4_ = fStack_420 * fVar170 - (float)uStack_3b0 * fVar128;
    auVar139._12_4_ = fStack_41c * fVar171 - uStack_3b0._4_4_ * fVar129;
    auVar155._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar167 - fVar109 * local_288._4_4_,
                  local_d8._0_4_ * fVar130 - fVar78 * local_288._0_4_);
    auVar155._8_4_ = local_d8._8_4_ * fVar170 - fVar128 * local_288._8_4_;
    auVar155._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
    auVar330._0_4_ = fVar130 * fStack_294 - fVar78 * fStack_2a4;
    auVar330._4_4_ = fVar167 * fStack_290 - fVar109 * fStack_2a0;
    auVar330._8_4_ = fVar170 * fStack_28c - fVar128 * fStack_29c;
    auVar330._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
    auVar101._0_8_ =
         CONCAT44(fVar253 * fVar167 - fVar149 * fVar109,fVar240 * fVar130 - fVar147 * fVar78);
    auVar101._8_4_ = fVar256 * fVar170 - fVar165 * fVar128;
    auVar101._12_4_ = fVar315 * fVar171 - fVar166 * fVar129;
    auVar290._0_4_ = local_108 * fVar130 - local_338 * fVar78;
    auVar290._4_4_ = fStack_104 * fVar167 - fStack_334 * fVar109;
    auVar290._8_4_ = fStack_100 * fVar170 - fStack_330 * fVar128;
    auVar290._12_4_ = fStack_fc * fVar171 - fStack_32c * fVar129;
    auVar226._0_8_ =
         CONCAT44(local_128._4_4_ * fVar167 - fVar109 * local_138._4_4_,
                  local_128._0_4_ * fVar130 - fVar78 * local_138._0_4_);
    auVar226._8_4_ = local_128._8_4_ * fVar170 - fVar128 * local_138._8_4_;
    auVar226._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
    auVar268._0_4_ = fVar130 * fVar253 - fVar78 * fVar149;
    auVar268._4_4_ = fVar167 * fVar256 - fVar109 * fVar165;
    auVar268._8_4_ = fVar170 * fVar315 - fVar128 * fVar166;
    auVar268._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
    auVar323._8_4_ = auVar189._8_4_;
    auVar323._0_8_ = auVar189._0_8_;
    auVar323._12_4_ = auVar189._12_4_;
    auVar123 = minps(auVar323,auVar139);
    auVar132 = maxps(auVar189,auVar139);
    auVar140._8_4_ = auVar155._8_4_;
    auVar140._0_8_ = auVar155._0_8_;
    auVar140._12_4_ = auVar155._12_4_;
    auVar79 = minps(auVar140,auVar330);
    auVar324 = minps(auVar123,auVar79);
    auVar79 = maxps(auVar155,auVar330);
    auVar134 = maxps(auVar132,auVar79);
    auVar141._8_4_ = auVar101._8_4_;
    auVar141._0_8_ = auVar101._0_8_;
    auVar141._12_4_ = auVar101._12_4_;
    auVar132 = minps(auVar141,auVar290);
    auVar79 = maxps(auVar101,auVar290);
    auVar156._8_4_ = auVar226._8_4_;
    auVar156._0_8_ = auVar226._0_8_;
    auVar156._12_4_ = auVar226._12_4_;
    auVar123 = minps(auVar156,auVar268);
    auVar132 = minps(auVar132,auVar123);
    auVar123 = minps(auVar324,auVar132);
    auVar132 = maxps(auVar226,auVar268);
    auVar79 = maxps(auVar79,auVar132);
    auVar79 = maxps(auVar134,auVar79);
    bVar71 = auVar123._4_4_ <= fStack_144;
    bVar25 = auVar123._8_4_ <= fStack_140;
    bVar26 = auVar123._12_4_ <= fStack_13c;
    auVar59._4_4_ = -(uint)bVar25;
    auVar59._0_4_ = -(uint)bVar71;
    auVar59._8_4_ = -(uint)bVar26;
    auVar59._12_4_ = 0;
    auVar326 = auVar59 << 0x20;
    auVar190._0_4_ =
         -(uint)(local_158 <= auVar79._0_4_ && auVar123._0_4_ <= local_148) & local_168._0_4_;
    auVar190._4_4_ = -(uint)(fStack_154 <= auVar79._4_4_ && bVar71) & local_168._4_4_;
    auVar190._8_4_ = -(uint)(fStack_150 <= auVar79._8_4_ && bVar25) & local_168._8_4_;
    auVar190._12_4_ = -(uint)(fStack_14c <= auVar79._12_4_ && bVar26) & local_168._12_4_;
    iVar65 = movmskps((int)pRVar66,auVar190);
    paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
    if (iVar65 != 0) {
      fVar130 = (fVar149 - fVar147) + (fStack_2a4 - local_2a8);
      fVar167 = (fVar165 - fVar149) + (fStack_2a0 - fStack_2a4);
      fVar170 = (fVar166 - fVar165) + (fStack_29c - fStack_2a0);
      fVar171 = (0.0 - fVar166) + (0.0 - fStack_29c);
      fVar78 = (fVar253 - fVar240) + (fStack_294 - local_298);
      fVar109 = (fVar256 - fVar253) + (fStack_290 - fStack_294);
      fVar128 = (fVar315 - fVar256) + (fStack_28c - fStack_290);
      fVar129 = (0.0 - fVar315) + (0.0 - fStack_28c);
      auVar331._0_8_ =
           CONCAT44(fStack_294 * fVar167 - fStack_2a4 * fVar109,
                    local_298 * fVar130 - local_2a8 * fVar78);
      auVar331._8_4_ = fStack_290 * fVar170 - fStack_2a0 * fVar128;
      auVar331._12_4_ = fStack_28c * fVar171 - fStack_29c * fVar129;
      auVar142._0_4_ = fVar107 * fVar130 - (float)local_3b8._0_4_ * fVar78;
      auVar142._4_4_ = fVar108 * fVar167 - (float)local_3b8._4_4_ * fVar109;
      auVar142._8_4_ = fStack_420 * fVar170 - (float)uStack_3b0 * fVar128;
      auVar142._12_4_ = fStack_41c * fVar171 - uStack_3b0._4_4_ * fVar129;
      auVar326._0_4_ = local_288._0_4_ * fVar78;
      auVar326._4_4_ = local_288._4_4_ * fVar109;
      auVar326._8_4_ = local_288._8_4_ * fVar128;
      auVar326._12_4_ = fVar129 * 0.0;
      auVar215._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar167 - auVar326._4_4_,
                    local_d8._0_4_ * fVar130 - auVar326._0_4_);
      auVar215._8_4_ = local_d8._8_4_ * fVar170 - auVar326._8_4_;
      auVar215._12_4_ = fVar171 * 0.0 - auVar326._12_4_;
      auVar157._0_4_ = fStack_294 * fVar130 - fStack_2a4 * fVar78;
      auVar157._4_4_ = fStack_290 * fVar167 - fStack_2a0 * fVar109;
      auVar157._8_4_ = fStack_28c * fVar170 - fStack_29c * fVar128;
      auVar157._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
      auVar317._0_8_ =
           CONCAT44(fVar253 * fVar167 - fVar149 * fVar109,fVar240 * fVar130 - fVar147 * fVar78);
      auVar317._8_4_ = fVar256 * fVar170 - fVar165 * fVar128;
      auVar317._12_4_ = fVar315 * fVar171 - fVar166 * fVar129;
      auVar168._0_4_ = local_108 * fVar130 - local_338 * fVar78;
      auVar168._4_4_ = fStack_104 * fVar167 - fStack_334 * fVar109;
      auVar168._8_4_ = fStack_100 * fVar170 - fStack_330 * fVar128;
      auVar168._12_4_ = fStack_fc * fVar171 - fStack_32c * fVar129;
      auVar291._0_8_ =
           CONCAT44(local_128._4_4_ * fVar167 - local_138._4_4_ * fVar109,
                    local_128._0_4_ * fVar130 - local_138._0_4_ * fVar78);
      auVar291._8_4_ = local_128._8_4_ * fVar170 - local_138._8_4_ * fVar128;
      auVar291._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
      auVar269._0_4_ = fVar130 * fVar253 - fVar78 * fVar149;
      auVar269._4_4_ = fVar167 * fVar256 - fVar109 * fVar165;
      auVar269._8_4_ = fVar170 * fVar315 - fVar128 * fVar166;
      auVar269._12_4_ = fVar171 * 0.0 - fVar129 * 0.0;
      auVar102._8_4_ = auVar331._8_4_;
      auVar102._0_8_ = auVar331._0_8_;
      auVar102._12_4_ = auVar331._12_4_;
      auVar79 = minps(auVar102,auVar142);
      auVar123 = maxps(auVar331,auVar142);
      auVar143._8_4_ = auVar215._8_4_;
      auVar143._0_8_ = auVar215._0_8_;
      auVar143._12_4_ = auVar215._12_4_;
      auVar132 = minps(auVar143,auVar157);
      auVar79 = minps(auVar79,auVar132);
      auVar132 = maxps(auVar215,auVar157);
      auVar324 = maxps(auVar123,auVar132);
      auVar144._8_4_ = auVar317._8_4_;
      auVar144._0_8_ = auVar317._0_8_;
      auVar144._12_4_ = auVar317._12_4_;
      auVar132 = minps(auVar144,auVar168);
      auVar134 = maxps(auVar317,auVar168);
      auVar158._8_4_ = auVar291._8_4_;
      auVar158._0_8_ = auVar291._0_8_;
      auVar158._12_4_ = auVar291._12_4_;
      auVar123 = minps(auVar158,auVar269);
      auVar132 = minps(auVar132,auVar123);
      auVar79 = minps(auVar79,auVar132);
      auVar132 = maxps(auVar291,auVar269);
      auVar132 = maxps(auVar134,auVar132);
      auVar132 = maxps(auVar324,auVar132);
      auVar332._0_4_ =
           -(uint)(local_158 <= auVar132._0_4_ && auVar79._0_4_ <= local_148) & auVar190._0_4_;
      auVar332._4_4_ =
           -(uint)(fStack_154 <= auVar132._4_4_ && auVar79._4_4_ <= fStack_144) & auVar190._4_4_;
      auVar332._8_4_ =
           -(uint)(fStack_150 <= auVar132._8_4_ && auVar79._8_4_ <= fStack_140) & auVar190._8_4_;
      auVar332._12_4_ =
           -(uint)(fStack_14c <= auVar132._12_4_ && auVar79._12_4_ <= fStack_13c) & auVar190._12_4_;
      uVar75 = movmskps(0,auVar332);
      paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar75;
    }
    if ((uint)paVar63 != 0) {
      auStack_1f8[uVar62] = (uint)paVar63;
      *(undefined8 *)(afStack_78 + uVar62 * 2) = local_358;
      auStack_58[uVar62] = local_418;
      uVar62 = (ulong)((int)uVar62 + 1);
    }
    do {
      if ((int)uVar62 == 0) {
        fVar148 = (ray->super_RayK<1>).tfar;
        auVar127._4_4_ = -(uint)(fStack_1b4 <= fVar148);
        auVar127._0_4_ = -(uint)(local_1b8 <= fVar148);
        auVar127._8_4_ = -(uint)(fStack_1b0 <= fVar148);
        auVar127._12_4_ = -(uint)(fStack_1ac <= fVar148);
        uVar73 = movmskps((int)paVar63,auVar127);
        uVar72 = uVar72 & SUB84(auVar69,0) & uVar73;
        if (uVar72 == 0) {
          return;
        }
        goto LAB_00bcdb72;
      }
      uVar76 = (int)uVar62 - 1;
      uVar64 = (ulong)uVar76;
      uVar75 = auStack_1f8[uVar64];
      local_418 = auStack_58[uVar64];
      uVar9 = 0;
      if (uVar75 != 0) {
        for (; (uVar75 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      uVar75 = uVar75 - 1 & uVar75;
      auStack_1f8[uVar64] = uVar75;
      if (uVar75 == 0) {
        uVar62 = (ulong)uVar76;
      }
      pRVar67 = (RTCIntersectArguments *)(uVar9 + 1);
      pRVar66 = pRVar67;
      if ((long)pRVar67 < 0) {
        pRVar66 = (RTCIntersectArguments *)((ulong)((uint)pRVar67 & 1) | (ulong)pRVar67 >> 1);
      }
      fVar78 = afStack_78[uVar64 * 2];
      fVar107 = *(float *)((long)auStack_58 + uVar64 * 8 + -0x1c);
      fVar108 = fVar78 * (1.0 - (float)uVar9 * 0.33333334) + fVar107 * (float)uVar9 * 0.33333334;
      fVar109 = fVar78 * (1.0 - (float)pRVar67 * 0.33333334) + fVar107 * (float)pRVar67 * 0.33333334
      ;
      fVar128 = fVar78 * 0.0 + fVar107 * 0.0;
      fVar107 = fVar78 * 0.0 + fVar107 * 0.0;
      fVar78 = fVar109 - fVar108;
      local_358 = CONCAT44(fVar109,fVar108);
      uStack_350 = CONCAT44(fVar107,fVar128);
      if (0.16666667 <= fVar78) break;
      fVar129 = (float)local_418;
      fVar130 = (float)((ulong)local_418 >> 0x20);
      fVar147 = 1.0 - fVar129;
      fVar149 = 1.0 - fVar129;
      fVar195 = 1.0 - fVar130;
      fVar196 = 1.0 - fVar130;
      fVar165 = (float)local_208 * fVar147 + (float)local_248 * fVar129;
      fVar166 = local_208._4_4_ * fVar149 + local_248._4_4_ * fVar129;
      fVar167 = (float)uStack_200 * fVar195 + (float)uStack_240 * fVar130;
      fVar170 = uStack_200._4_4_ * fVar196 + uStack_240._4_4_ * fVar130;
      fVar197 = (float)local_218 * fVar147 + (float)local_258 * fVar129;
      fVar207 = local_218._4_4_ * fVar149 + local_258._4_4_ * fVar129;
      fVar208 = (float)uStack_210 * fVar195 + (float)uStack_250 * fVar130;
      fVar209 = uStack_210._4_4_ * fVar196 + uStack_250._4_4_ * fVar130;
      fVar218 = (float)local_228 * fVar147 + (float)local_268 * fVar129;
      fVar240 = local_228._4_4_ * fVar149 + local_268._4_4_ * fVar129;
      fVar256 = (float)uStack_220 * fVar195 + (float)uStack_260 * fVar130;
      fVar224 = uStack_220._4_4_ * fVar196 + uStack_260._4_4_ * fVar130;
      fVar171 = (fVar147 * (float)local_238 + fVar129 * (float)local_278) - fVar218;
      fVar172 = (fVar149 * local_238._4_4_ + fVar129 * local_278._4_4_) - fVar240;
      fVar195 = (fVar195 * (float)uStack_230 + fVar130 * (float)uStack_270) - fVar256;
      fVar196 = (fVar196 * uStack_230._4_4_ + fVar130 * uStack_270._4_4_) - fVar224;
      fVar129 = fVar108 * (fVar218 - fVar197) + fVar197;
      fVar130 = fVar108 * (fVar240 - fVar207) + fVar207;
      fVar147 = fVar108 * (fVar256 - fVar208) + fVar208;
      fVar149 = fVar108 * (fVar224 - fVar209) + fVar209;
      fVar219 = (fVar218 - fVar197) * fVar109 + fVar197;
      fVar253 = (fVar240 - fVar207) * fVar109 + fVar207;
      fVar315 = (fVar256 - fVar208) * fVar109 + fVar208;
      fVar235 = (fVar224 - fVar209) * fVar109 + fVar209;
      fVar237 = fVar108 * (fVar197 - fVar165) + fVar165;
      fVar261 = fVar108 * (fVar207 - fVar166) + fVar166;
      fVar272 = fVar108 * (fVar208 - fVar167) + fVar167;
      fVar275 = fVar108 * (fVar209 - fVar170) + fVar170;
      fVar237 = (fVar129 - fVar237) * fVar108 + fVar237;
      fVar261 = (fVar130 - fVar261) * fVar108 + fVar261;
      fVar272 = (fVar147 - fVar272) * fVar108 + fVar272;
      fVar275 = (fVar149 - fVar275) * fVar108 + fVar275;
      fVar129 = (((fVar108 * fVar171 + fVar218) - fVar129) * fVar108 + fVar129) - fVar237;
      fVar130 = (((fVar108 * fVar172 + fVar240) - fVar130) * fVar108 + fVar130) - fVar261;
      fVar147 = (((fVar108 * fVar195 + fVar256) - fVar147) * fVar108 + fVar147) - fVar272;
      fVar149 = (((fVar108 * fVar196 + fVar224) - fVar149) * fVar108 + fVar149) - fVar275;
      auVar103._0_4_ = fVar108 * fVar129 + fVar237;
      auVar103._4_4_ = fVar108 * fVar130 + fVar261;
      auVar103._8_4_ = fVar108 * fVar147 + fVar272;
      auVar103._12_4_ = fVar108 * fVar149 + fVar275;
      fVar165 = (fVar197 - fVar165) * fVar109 + fVar165;
      fVar166 = (fVar207 - fVar166) * fVar109 + fVar166;
      fVar167 = (fVar208 - fVar167) * fVar109 + fVar167;
      fVar170 = (fVar209 - fVar170) * fVar109 + fVar170;
      fVar165 = (fVar219 - fVar165) * fVar109 + fVar165;
      fVar166 = (fVar253 - fVar166) * fVar109 + fVar166;
      fVar167 = (fVar315 - fVar167) * fVar109 + fVar167;
      fVar170 = (fVar235 - fVar170) * fVar109 + fVar170;
      fVar197 = (((fVar171 * fVar109 + fVar218) - fVar219) * fVar109 + fVar219) - fVar165;
      fVar207 = (((fVar172 * fVar109 + fVar240) - fVar253) * fVar109 + fVar253) - fVar166;
      fVar208 = (((fVar195 * fVar109 + fVar256) - fVar315) * fVar109 + fVar315) - fVar167;
      fVar209 = (((fVar196 * fVar109 + fVar224) - fVar235) * fVar109 + fVar235) - fVar170;
      fVar165 = fVar109 * fVar197 + fVar165;
      fVar166 = fVar109 * fVar207 + fVar166;
      fVar167 = fVar109 * fVar208 + fVar167;
      fVar170 = fVar109 * fVar209 + fVar170;
      fVar218 = fVar78 * 0.33333334;
      fVar171 = fVar129 * 3.0 * fVar218 + auVar103._0_4_;
      fVar172 = fVar130 * 3.0 * fVar218 + auVar103._4_4_;
      fVar195 = fVar147 * 3.0 * fVar218 + auVar103._8_4_;
      fVar196 = fVar149 * 3.0 * fVar218 + auVar103._12_4_;
      fVar197 = fVar165 - fVar218 * fVar197 * 3.0;
      fVar207 = fVar166 - fVar218 * fVar207 * 3.0;
      fVar208 = fVar167 - fVar218 * fVar208 * 3.0;
      fVar209 = fVar170 - fVar218 * fVar209 * 3.0;
      auVar29._4_8_ = auVar326._8_8_;
      auVar29._0_4_ = auVar103._4_4_;
      auVar325._0_8_ = auVar29._0_8_ << 0x20;
      auVar325._8_4_ = auVar103._8_4_;
      auVar325._12_4_ = auVar103._12_4_;
      auVar326._8_8_ = auVar103._8_8_;
      auVar326._0_8_ = auVar325._8_8_;
      fVar253 = (fVar167 - fVar165) + (auVar103._8_4_ - auVar103._0_4_);
      fVar256 = (fVar170 - fVar166) + (auVar103._12_4_ - auVar103._4_4_);
      auVar227._0_4_ = fVar256 * fVar166;
      auVar227._4_4_ = fVar256 * fVar166;
      auVar227._8_4_ = fVar256 * fVar170;
      auVar227._12_4_ = fVar256 * fVar170;
      fVar129 = auVar103._0_4_ * fVar253 + auVar103._4_4_ * fVar256;
      fVar130 = auVar103._8_4_ * fVar253 + auVar103._12_4_ * fVar256;
      fVar315 = fVar171 * fVar253 + fVar172 * fVar256;
      fVar224 = fVar195 * fVar253 + fVar196 * fVar256;
      fVar218 = fVar197 * fVar253 + fVar207 * fVar256;
      auVar247._4_4_ = fVar207 * fVar253 + fVar207 * fVar256;
      auVar247._0_4_ = fVar218;
      fVar219 = fVar208 * fVar253 + fVar209 * fVar256;
      fVar147 = fVar253 * fVar165 + auVar227._0_4_;
      fVar240 = fVar253 * fVar167 + auVar227._8_4_;
      auVar30._4_8_ = auVar227._8_8_;
      auVar30._0_4_ = fVar172 * fVar253 + fVar172 * fVar256;
      auVar228._0_8_ = auVar30._0_8_ << 0x20;
      auVar228._8_4_ = fVar224;
      auVar228._12_4_ = fVar196 * fVar253 + fVar196 * fVar256;
      fVar149 = fVar315;
      if (fVar315 <= fVar129) {
        fVar149 = fVar129;
        fVar129 = fVar315;
      }
      auVar229._8_8_ = auVar228._8_8_;
      auVar229._0_8_ = auVar229._8_8_;
      auVar247._8_4_ = fVar219;
      auVar247._12_4_ = fVar209 * fVar253 + fVar209 * fVar256;
      if (fVar147 <= fVar218) {
        auVar247._0_4_ = fVar147;
      }
      if (auVar247._0_4_ <= fVar129) {
        fVar129 = auVar247._0_4_;
      }
      auVar31._4_8_ = auVar247._8_8_;
      auVar31._0_4_ = fVar253 * fVar166 + auVar227._4_4_;
      auVar248._0_8_ = auVar31._0_8_ << 0x20;
      auVar248._8_4_ = fVar240;
      auVar248._12_4_ = fVar253 * fVar170 + auVar227._12_4_;
      if (fVar147 <= fVar218) {
        fVar147 = fVar218;
      }
      auVar249._8_8_ = auVar248._8_8_;
      auVar249._0_8_ = auVar249._8_8_;
      if (fVar147 <= fVar149) {
        fVar147 = fVar149;
      }
      if (fVar224 <= fVar130) {
        auVar229._0_4_ = fVar130;
        fVar130 = fVar224;
      }
      fVar149 = fVar219;
      if (fVar240 <= fVar219) {
        fVar149 = fVar240;
      }
      if (fVar149 <= fVar130) {
        fVar130 = fVar149;
      }
      if (fVar240 <= fVar219) {
        auVar249._0_4_ = fVar219;
      }
      if (auVar249._0_4_ <= auVar229._0_4_) {
        auVar249._0_4_ = auVar229._0_4_;
      }
      bVar71 = 3 < (uint)uVar62;
      uVar32 = (undefined3)(uVar76 >> 8);
      fVar149 = auVar249._0_4_;
      if ((0.0001 <= fVar129) || (fVar149 <= -0.0001)) {
        if ((-0.0001 < fVar147 && fVar130 < 0.0001) ||
           ((fVar129 < 0.0001 && -0.0001 < fVar147 || (fVar130 < 0.0001 && -0.0001 < fVar149))))
        goto LAB_00bcf25a;
        bVar25 = true;
        paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar32,bVar71);
        pRVar66 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar66 >> 8),fVar78 < 0.001);
      }
      else {
LAB_00bcf25a:
        _local_3b8 = auVar326;
        local_418 = CONCAT44(fVar170,fVar167);
        bVar71 = bVar71 || fVar78 < 0.001;
        paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar32,bVar71);
        fVar240 = (float)(~-(uint)(fVar129 < 0.0) & 0x3f800000 | -(uint)(fVar129 < 0.0) & 0xbf800000
                         );
        fVar219 = (float)(~-(uint)(fVar147 < 0.0) & 0x3f800000 | -(uint)(fVar147 < 0.0) & 0xbf800000
                         );
        fVar218 = 0.0;
        if ((fVar240 == fVar219) && (!NAN(fVar240) && !NAN(fVar219))) {
          fVar218 = INFINITY;
        }
        fVar253 = 0.0;
        if ((fVar240 == fVar219) && (!NAN(fVar240) && !NAN(fVar219))) {
          fVar253 = -INFINITY;
        }
        fVar256 = (float)(~-(uint)(fVar130 < 0.0) & 0x3f800000 | -(uint)(fVar130 < 0.0) & 0xbf800000
                         );
        if ((fVar240 != fVar256) || (fVar315 = fVar253, NAN(fVar240) || NAN(fVar256))) {
          if ((fVar130 != fVar129) || (NAN(fVar130) || NAN(fVar129))) {
            fVar130 = -fVar129 / (fVar130 - fVar129);
            fVar130 = (1.0 - fVar130) * 0.0 + fVar130;
            fVar315 = fVar130;
          }
          else {
            fVar130 = INFINITY;
            if ((fVar129 == 0.0) && (fVar130 = INFINITY, !NAN(fVar129))) {
              fVar130 = 0.0;
            }
            fVar315 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar129 == 0.0) & 1) * 4);
          }
          if (fVar130 <= fVar218) {
            fVar218 = fVar130;
          }
          if (fVar315 <= fVar253) {
            fVar315 = fVar253;
          }
        }
        pRVar66 = (RTCIntersectArguments *)(ulong)(fVar149 < 0.0);
        fVar129 = *(float *)(&DAT_01ff1ecc + (long)pRVar66 * 4);
        if ((fVar219 != fVar129) || (fVar130 = fVar315, NAN(fVar219) || NAN(fVar129))) {
          if ((fVar149 != fVar147) || (NAN(fVar149) || NAN(fVar147))) {
            fVar149 = -fVar147 / (fVar149 - fVar147);
            fVar149 = (1.0 - fVar149) * 0.0 + fVar149;
            fVar130 = fVar149;
          }
          else {
            fVar149 = INFINITY;
            if ((fVar147 == 0.0) && (fVar149 = INFINITY, !NAN(fVar147))) {
              fVar149 = 0.0;
            }
            pRVar66 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar147 == 0.0) & 1);
            fVar130 = *(float *)(&DAT_01ff1ec4 + (long)pRVar66 * 4);
          }
          if (fVar149 <= fVar218) {
            fVar218 = fVar149;
          }
          if (fVar130 <= fVar315) {
            fVar130 = fVar315;
          }
        }
        auVar326 = ZEXT816(0x3f80000000000000);
        if ((fVar256 != fVar129) || (NAN(fVar256) || NAN(fVar129))) {
          fVar218 = (float)(~-(uint)(fVar218 < 1.0) & 0x3f800000 |
                           (uint)fVar218 & -(uint)(fVar218 < 1.0));
          fVar130 = (float)(~-(uint)(fVar130 < 1.0) & (uint)fVar130 |
                           -(uint)(fVar130 < 1.0) & 0x3f800000);
        }
        uVar75 = -(uint)(fVar130 < auVar326._4_4_);
        fVar218 = (float)(~-(uint)(fVar218 < 0.0) & (uint)fVar218);
        fVar129 = (float)(~uVar75 & 0x3f800000 | (uint)fVar130 & uVar75);
        bVar25 = true;
        if (fVar218 <= fVar129) {
          fVar218 = fVar218 + -0.1;
          fVar129 = fVar129 + 0.1;
          uVar75 = -(uint)(fVar129 < auVar326._4_4_);
          fVar218 = (float)(~-(uint)(fVar218 < 0.0) & (uint)fVar218);
          fVar235 = (float)(~uVar75 & 0x3f800000 | (uint)fVar129 & uVar75);
          fVar253 = 1.0 - fVar218;
          fVar256 = 1.0 - fVar218;
          fVar315 = 1.0 - fVar235;
          fVar224 = 1.0 - fVar235;
          fVar129 = auVar103._0_4_ * fVar253 + auVar103._8_4_ * fVar218;
          fVar130 = auVar103._4_4_ * fVar256 + auVar103._12_4_ * fVar218;
          fVar147 = auVar103._0_4_ * fVar315 + auVar103._8_4_ * fVar235;
          fVar149 = auVar103._4_4_ * fVar224 + auVar103._12_4_ * fVar235;
          fVar219 = fVar171 * fVar253 + fVar195 * fVar218;
          fVar240 = fVar172 * fVar256 + fVar196 * fVar218;
          fVar171 = fVar171 * fVar315 + fVar195 * fVar235;
          fVar172 = fVar172 * fVar224 + fVar196 * fVar235;
          fVar195 = fVar197 * fVar253 + fVar208 * fVar218;
          fVar196 = fVar207 * fVar256 + fVar209 * fVar218;
          fVar197 = fVar197 * fVar315 + fVar208 * fVar235;
          fVar207 = fVar207 * fVar224 + fVar209 * fVar235;
          fVar208 = fVar253 * fVar165 + fVar167 * fVar218;
          fVar209 = fVar256 * fVar166 + fVar170 * fVar218;
          fVar165 = fVar315 * fVar165 + fStack_420 * fVar235;
          fVar166 = fVar224 * fVar166 + fStack_41c * fVar235;
          fVar309 = fVar167 * (1.0 - fVar218) + fVar170 * fVar218;
          fStack_41c = fVar167 * (1.0 - fVar235) + fVar170 * fVar235;
          fVar78 = 1.0 / fVar78;
          auVar125._0_4_ = fVar165 - fVar208;
          auVar125._4_4_ = fVar166 - fVar209;
          auVar125._8_4_ = fVar165 - fVar165;
          auVar125._12_4_ = fVar166 - fVar166;
          auVar159._0_8_ = CONCAT44(fVar207 - fVar196,fVar197 - fVar195);
          auVar159._8_4_ = fVar197 - fVar197;
          auVar159._12_4_ = fVar207 - fVar207;
          auVar270._0_4_ = fVar171 - fVar219;
          auVar270._4_4_ = fVar172 - fVar240;
          auVar270._8_4_ = fVar171 - fVar171;
          auVar270._12_4_ = fVar172 - fVar172;
          auVar216._0_8_ = CONCAT44((fVar240 - fVar130) * 3.0,(fVar219 - fVar129) * 3.0);
          auVar216._8_4_ = (fVar171 - fVar147) * 3.0;
          auVar216._12_4_ = (fVar172 - fVar149) * 3.0;
          auVar191._0_8_ = CONCAT44((fVar196 - fVar240) * 3.0,(fVar195 - fVar219) * 3.0);
          auVar191._8_4_ = (fVar197 - fVar171) * 3.0;
          auVar191._12_4_ = (fVar207 - fVar172) * 3.0;
          auVar250._0_4_ = (fVar208 - fVar195) * 3.0;
          auVar250._4_4_ = (fVar209 - fVar196) * 3.0;
          auVar250._8_4_ = (fVar165 - fVar197) * 3.0;
          auVar250._12_4_ = (fVar166 - fVar207) * 3.0;
          auVar199._8_4_ = auVar191._8_4_;
          auVar199._0_8_ = auVar191._0_8_;
          auVar199._12_4_ = auVar191._12_4_;
          auVar132 = minps(auVar199,auVar250);
          auVar79 = maxps(auVar191,auVar250);
          auVar230._8_4_ = auVar216._8_4_;
          auVar230._0_8_ = auVar216._0_8_;
          auVar230._12_4_ = auVar216._12_4_;
          auVar134 = minps(auVar230,auVar132);
          auVar123 = maxps(auVar216,auVar79);
          auVar33._4_8_ = auVar79._8_8_;
          auVar33._0_4_ = auVar134._4_4_;
          auVar192._0_8_ = auVar33._0_8_ << 0x20;
          auVar192._8_4_ = auVar134._8_4_;
          auVar192._12_4_ = auVar134._12_4_;
          auVar193._8_8_ = auVar134._8_8_;
          auVar193._0_8_ = auVar192._8_8_;
          auVar34._4_8_ = auVar132._8_8_;
          auVar34._0_4_ = auVar123._4_4_;
          auVar200._0_8_ = auVar34._0_8_ << 0x20;
          auVar200._8_4_ = auVar123._8_4_;
          auVar200._12_4_ = auVar123._12_4_;
          auVar201._8_8_ = auVar123._8_8_;
          auVar201._0_8_ = auVar200._8_8_;
          auVar132 = minps(auVar134,auVar193);
          auVar79 = maxps(auVar123,auVar201);
          fVar235 = auVar132._0_4_ * fVar78;
          fVar237 = auVar132._4_4_ * fVar78;
          fVar261 = auVar132._8_4_ * fVar78;
          fVar272 = auVar132._12_4_ * fVar78;
          fVar197 = fVar78 * auVar79._0_4_;
          fVar208 = fVar78 * auVar79._4_4_;
          fVar218 = fVar78 * auVar79._8_4_;
          fVar78 = fVar78 * auVar79._12_4_;
          fVar315 = 1.0 / (fStack_41c - fVar309);
          auVar145._0_8_ = CONCAT44(fVar149 - fVar130,fVar147 - fVar129);
          auVar145._8_4_ = fVar147 - fVar147;
          auVar145._12_4_ = fVar149 - fVar149;
          auVar202._8_4_ = auVar145._8_4_;
          auVar202._0_8_ = auVar145._0_8_;
          auVar202._12_4_ = auVar145._12_4_;
          auVar123 = minps(auVar202,auVar270);
          auVar132 = maxps(auVar145,auVar270);
          auVar104._8_4_ = auVar159._8_4_;
          auVar104._0_8_ = auVar159._0_8_;
          auVar104._12_4_ = auVar159._12_4_;
          auVar79 = minps(auVar104,auVar125);
          auVar123 = minps(auVar123,auVar79);
          auVar79 = maxps(auVar159,auVar125);
          auVar79 = maxps(auVar132,auVar79);
          fVar253 = auVar123._0_4_ * fVar315;
          fVar256 = auVar123._4_4_ * fVar315;
          fVar224 = fVar315 * auVar79._0_4_;
          fVar315 = fVar315 * auVar79._4_4_;
          local_418 = CONCAT44(fStack_41c,fVar309);
          auVar194._4_4_ = fStack_41c;
          auVar194._0_4_ = fVar109;
          auVar194._8_4_ = fVar128;
          auVar194._12_4_ = fVar107;
          fVar129 = (fVar108 + fVar109) * 0.5;
          fVar130 = (fVar309 + fStack_41c) * 0.5;
          fVar147 = (fVar109 + fVar128) * 0.0;
          fVar149 = (fStack_41c + fVar107) * 0.0;
          fVar165 = local_88 * fVar129 + local_308;
          fVar167 = fStack_84 * fVar129 + fStack_304;
          fVar166 = fStack_80 * fVar129 + fStack_300;
          fVar170 = fStack_7c * fVar129 + fStack_2fc;
          fVar171 = local_98 * fVar129 + (float)local_318._0_4_;
          fVar172 = fStack_94 * fVar129 + (float)local_318._4_4_;
          fVar195 = fStack_90 * fVar129 + fStack_310;
          fVar196 = fStack_8c * fVar129 + fStack_30c;
          fVar165 = (fVar171 - fVar165) * fVar129 + fVar165;
          fVar167 = (fVar172 - fVar167) * fVar129 + fVar167;
          fVar166 = (fVar195 - fVar166) * fVar129 + fVar166;
          fVar170 = (fVar196 - fVar170) * fVar129 + fVar170;
          fVar171 = (((local_a8 * fVar129 + (float)local_328) - fVar171) * fVar129 + fVar171) -
                    fVar165;
          fVar172 = (((fStack_a4 * fVar129 + local_328._4_4_) - fVar172) * fVar129 + fVar172) -
                    fVar167;
          fVar195 = (((fStack_a0 * fVar129 + (float)uStack_320) - fVar195) * fVar129 + fVar195) -
                    fVar166;
          fVar196 = (((fStack_9c * fVar129 + uStack_320._4_4_) - fVar196) * fVar129 + fVar196) -
                    fVar170;
          fVar165 = fVar129 * fVar171 + fVar165;
          fVar167 = fVar129 * fVar172 + fVar167;
          fVar171 = fVar171 * 3.0;
          fVar172 = fVar172 * 3.0;
          fVar166 = (fVar129 * fVar195 + fVar166) - fVar165;
          fVar170 = (fVar129 * fVar196 + fVar170) - fVar167;
          fVar171 = (fVar195 * 3.0 - fVar171) * fVar130 + fVar171;
          fVar172 = (fVar196 * 3.0 - fVar172) * fVar130 + fVar172;
          auVar126._0_8_ = CONCAT44(fVar171,fVar166) ^ 0x80000000;
          auVar126._8_4_ = fVar171;
          auVar126._12_4_ = fVar171;
          fVar275 = fVar108 - fVar129;
          fVar283 = fVar309 - fVar130;
          fVar293 = fVar109 - fVar147;
          fVar295 = fStack_41c - fVar149;
          fVar297 = fVar109 - fVar129;
          fVar299 = fStack_41c - fVar130;
          fVar128 = fVar128 - fVar147;
          fVar107 = fVar107 - fVar149;
          fVar165 = fVar166 * fVar130 + fVar165;
          fVar167 = fVar170 * fVar130 + fVar167;
          auVar146._0_8_ = CONCAT44(fVar172,fVar170) ^ 0x8000000000000000;
          auVar146._8_4_ = -fVar172;
          auVar146._12_4_ = -fVar172;
          auVar306._0_4_ = fVar170 * fVar171 - fVar172 * fVar166;
          auVar306._4_4_ = auVar306._0_4_;
          auVar306._8_4_ = auVar306._0_4_;
          auVar306._12_4_ = auVar306._0_4_;
          auVar132 = divps(auVar146,auVar306);
          auVar79 = divps(auVar126,auVar306);
          fVar171 = auVar132._0_4_;
          fVar172 = auVar132._4_4_;
          fVar166 = auVar79._0_4_;
          fVar170 = auVar79._4_4_;
          fVar129 = fVar129 - (fVar167 * fVar166 + fVar165 * fVar171);
          fVar147 = fVar130 - (fVar167 * fVar170 + fVar165 * fVar172);
          fVar149 = fVar130 - (fVar167 * auVar79._8_4_ + fVar165 * auVar132._8_4_);
          fVar130 = fVar130 - (fVar167 * auVar79._12_4_ + fVar165 * auVar132._12_4_);
          auVar327._0_8_ = CONCAT44(fVar172 * fVar253,fVar172 * fVar235);
          auVar327._8_4_ = fVar172 * fVar237;
          auVar327._12_4_ = fVar172 * fVar256;
          auVar251._0_4_ = fVar172 * fVar197;
          auVar251._4_4_ = fVar172 * fVar224;
          auVar251._8_4_ = fVar172 * fVar208;
          auVar251._12_4_ = fVar172 * fVar315;
          auVar333._8_4_ = auVar327._8_4_;
          auVar333._0_8_ = auVar327._0_8_;
          auVar333._12_4_ = auVar327._12_4_;
          auVar134 = minps(auVar333,auVar251);
          auVar132 = maxps(auVar251,auVar327);
          auVar160._0_8_ = CONCAT44(fVar170 * fVar256,fVar170 * fVar237);
          auVar160._8_4_ = fVar170 * fVar261;
          auVar160._12_4_ = fVar170 * fVar272;
          auVar328._0_4_ = fVar170 * fVar208;
          auVar328._4_4_ = fVar170 * fVar315;
          auVar328._8_4_ = fVar170 * fVar218;
          auVar328._12_4_ = fVar170 * fVar78;
          auVar231._8_4_ = auVar160._8_4_;
          auVar231._0_8_ = auVar160._0_8_;
          auVar231._12_4_ = auVar160._12_4_;
          auVar79 = minps(auVar231,auVar328);
          auVar123 = maxps(auVar328,auVar160);
          fVar165 = 0.0 - (auVar123._0_4_ + auVar132._0_4_);
          fVar167 = 1.0 - (auVar123._4_4_ + auVar132._4_4_);
          fVar195 = 0.0 - (auVar123._8_4_ + auVar132._8_4_);
          fVar196 = 0.0 - (auVar123._12_4_ + auVar132._12_4_);
          fVar207 = 0.0 - (auVar79._0_4_ + auVar134._0_4_);
          fVar209 = 1.0 - (auVar79._4_4_ + auVar134._4_4_);
          fVar219 = 0.0 - (auVar79._8_4_ + auVar134._8_4_);
          fVar240 = 0.0 - (auVar79._12_4_ + auVar134._12_4_);
          auVar252._0_8_ = CONCAT44(fVar283 * fVar167,fVar275 * fVar165);
          auVar252._8_4_ = fVar293 * fVar195;
          auVar252._12_4_ = fVar295 * fVar196;
          auVar307._0_8_ = CONCAT44(fVar253 * fVar171,fVar235 * fVar171);
          auVar307._8_4_ = fVar237 * fVar171;
          auVar307._12_4_ = fVar256 * fVar171;
          auVar232._0_4_ = fVar171 * fVar197;
          auVar232._4_4_ = fVar171 * fVar224;
          auVar232._8_4_ = fVar171 * fVar208;
          auVar232._12_4_ = fVar171 * fVar315;
          auVar318._8_4_ = auVar307._8_4_;
          auVar318._0_8_ = auVar307._0_8_;
          auVar318._12_4_ = auVar307._12_4_;
          auVar132 = minps(auVar318,auVar232);
          auVar79 = maxps(auVar232,auVar307);
          auVar203._0_8_ = CONCAT44(fVar256 * fVar166,fVar237 * fVar166);
          auVar203._8_4_ = fVar261 * fVar166;
          auVar203._12_4_ = fVar272 * fVar166;
          auVar329._0_4_ = fVar166 * fVar208;
          auVar329._4_4_ = fVar166 * fVar315;
          auVar329._8_4_ = fVar166 * fVar218;
          auVar329._12_4_ = fVar166 * fVar78;
          auVar334._8_4_ = auVar203._8_4_;
          auVar334._0_8_ = auVar203._0_8_;
          auVar334._12_4_ = auVar203._12_4_;
          auVar134 = minps(auVar334,auVar329);
          auVar308._0_4_ = fVar275 * fVar207;
          auVar308._4_4_ = fVar283 * fVar209;
          auVar308._8_4_ = fVar293 * fVar219;
          auVar308._12_4_ = fVar295 * fVar240;
          auVar161._0_8_ = CONCAT44(fVar167 * fVar299,fVar165 * fVar297);
          auVar161._8_4_ = fVar195 * fVar128;
          auVar161._12_4_ = fVar196 * fVar107;
          auVar169._0_4_ = fVar207 * fVar297;
          auVar169._4_4_ = fVar209 * fVar299;
          auVar169._8_4_ = fVar219 * fVar128;
          auVar169._12_4_ = fVar240 * fVar107;
          auVar123 = maxps(auVar329,auVar203);
          auVar326._0_4_ = auVar123._0_4_ + auVar79._0_4_;
          auVar326._4_4_ = auVar123._4_4_ + auVar79._4_4_;
          auVar326._8_4_ = auVar123._8_4_ + auVar79._8_4_;
          auVar326._12_4_ = auVar123._12_4_ + auVar79._12_4_;
          fVar78 = 1.0 - (auVar134._0_4_ + auVar132._0_4_);
          fVar165 = 0.0 - (auVar134._4_4_ + auVar132._4_4_);
          fVar167 = 0.0 - (auVar134._8_4_ + auVar132._8_4_);
          fVar195 = 0.0 - (auVar134._12_4_ + auVar132._12_4_);
          auVar233._0_8_ =
               CONCAT44(fVar283 * (0.0 - auVar326._4_4_),fVar275 * (1.0 - auVar326._0_4_));
          auVar233._8_4_ = fVar293 * (0.0 - auVar326._8_4_);
          auVar233._12_4_ = fVar295 * (0.0 - auVar326._12_4_);
          auVar271._0_4_ = fVar275 * fVar78;
          auVar271._4_4_ = fVar283 * fVar165;
          auVar271._8_4_ = fVar293 * fVar167;
          auVar271._12_4_ = fVar295 * fVar195;
          auVar204._0_8_ =
               CONCAT44((0.0 - auVar326._4_4_) * fVar299,(1.0 - auVar326._0_4_) * fVar297);
          auVar204._8_4_ = (0.0 - auVar326._8_4_) * fVar128;
          auVar204._12_4_ = (0.0 - auVar326._12_4_) * fVar107;
          auVar217._0_4_ = fVar78 * fVar297;
          auVar217._4_4_ = fVar165 * fVar299;
          auVar217._8_4_ = fVar167 * fVar128;
          auVar217._12_4_ = fVar195 * fVar107;
          auVar292._8_4_ = auVar233._8_4_;
          auVar292._0_8_ = auVar233._0_8_;
          auVar292._12_4_ = auVar233._12_4_;
          auVar79 = minps(auVar292,auVar271);
          auVar319._8_4_ = auVar204._8_4_;
          auVar319._0_8_ = auVar204._0_8_;
          auVar319._12_4_ = auVar204._12_4_;
          auVar132 = minps(auVar319,auVar217);
          auVar134 = minps(auVar79,auVar132);
          auVar132 = maxps(auVar271,auVar233);
          auVar79 = maxps(auVar217,auVar204);
          auVar123 = maxps(auVar79,auVar132);
          auVar205._8_4_ = auVar252._8_4_;
          auVar205._0_8_ = auVar252._0_8_;
          auVar205._12_4_ = auVar252._12_4_;
          auVar79 = minps(auVar205,auVar308);
          auVar234._8_4_ = auVar161._8_4_;
          auVar234._0_8_ = auVar161._0_8_;
          auVar234._12_4_ = auVar161._12_4_;
          auVar132 = minps(auVar234,auVar169);
          auVar132 = minps(auVar79,auVar132);
          auVar324 = maxps(auVar308,auVar252);
          auVar79 = maxps(auVar169,auVar161);
          auVar79 = maxps(auVar79,auVar324);
          auVar206._0_4_ = auVar134._4_4_ + auVar134._0_4_ + fVar129;
          auVar206._4_4_ = auVar132._4_4_ + auVar132._0_4_ + fVar147;
          auVar206._8_4_ = auVar134._8_4_ + auVar134._4_4_ + fVar149;
          auVar206._12_4_ = auVar134._12_4_ + auVar132._4_4_ + fVar130;
          fVar78 = auVar123._4_4_ + auVar123._0_4_ + fVar129;
          fVar107 = auVar79._4_4_ + auVar79._0_4_ + fVar147;
          auVar162._4_4_ = fVar107;
          auVar162._0_4_ = fVar78;
          auVar36._4_4_ = fVar309;
          auVar36._0_4_ = fVar108;
          auVar36._8_4_ = fVar109;
          auVar36._12_4_ = fStack_41c;
          auVar132 = maxps(auVar36,auVar206);
          auVar162._8_4_ = auVar123._8_4_ + auVar123._4_4_ + fVar149;
          auVar162._12_4_ = auVar123._12_4_ + auVar79._4_4_ + fVar130;
          auVar79 = minps(auVar162,auVar194);
          iVar65 = -(uint)(auVar79._0_4_ < auVar132._0_4_);
          iVar74 = -(uint)(auVar79._4_4_ < auVar132._4_4_);
          auVar164._4_4_ = iVar74;
          auVar164._0_4_ = iVar65;
          auVar164._8_4_ = iVar74;
          auVar164._12_4_ = iVar74;
          auVar163._8_8_ = auVar164._8_8_;
          auVar163._4_4_ = iVar65;
          auVar163._0_4_ = iVar65;
          uVar75 = movmskpd((int)pRVar66,auVar163);
          pRVar66 = (RTCIntersectArguments *)(ulong)uVar75;
          fStack_420 = fVar109;
          if (uVar75 == 0) {
            pRVar66 = (RTCIntersectArguments *)0x0;
            if (auVar206._0_4_ <= fVar108) {
              auVar326._0_12_ = ZEXT812(0x40400000);
              auVar326._12_4_ = 0.0;
              auVar335._4_4_ = fStack_304;
              auVar335._0_4_ = local_308;
              auVar335._8_4_ = fStack_300;
              auVar335._12_4_ = fStack_2fc;
            }
            else {
              auVar326._0_12_ = ZEXT812(0x40400000);
              auVar326._12_4_ = 0.0;
              auVar335._4_4_ = fStack_304;
              auVar335._0_4_ = local_308;
              auVar335._8_4_ = fStack_300;
              auVar335._12_4_ = fStack_2fc;
              if (fVar78 < fVar109) {
                iVar65 = -(uint)(fVar107 < fStack_41c);
                pRVar66 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar65 >> 8),
                                          (byte)iVar65 & fVar309 < auVar206._4_4_);
              }
            }
            bVar60 = bVar71 | (byte)pRVar66;
            if (bVar60 == 1) {
              paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
              do {
                fVar107 = 1.0 - fVar129;
                fVar128 = fVar129 * fVar129 * fVar129;
                fVar149 = auVar326._0_4_;
                fVar109 = fVar129 * fVar129 * fVar149 * fVar107;
                fVar78 = fVar107 * fVar107 * fVar107;
                fVar130 = fVar129 * fVar149 * fVar107 * fVar107;
                fVar107 = fVar78 * auVar335._0_4_ +
                          fVar130 * (float)local_318._0_4_ +
                          fVar109 * (float)local_328 + fVar128 * (float)local_b8._0_4_;
                fVar108 = fVar78 * auVar335._4_4_ +
                          fVar130 * (float)local_318._4_4_ +
                          fVar109 * local_328._4_4_ + fVar128 * (float)local_b8._4_4_;
                fVar107 = ((fVar78 * auVar335._8_4_ +
                           fVar130 * fStack_310 + fVar109 * (float)uStack_320 + fVar128 * fStack_b0)
                          - fVar107) * fVar147 + fVar107;
                fVar108 = ((fVar78 * auVar335._12_4_ +
                           fVar130 * fStack_30c + fVar109 * uStack_320._4_4_ + fVar128 * fStack_ac)
                          - fVar108) * fVar147 + fVar108;
                fVar129 = fVar129 - (fVar108 * fVar166 + fVar107 * fVar171);
                fVar147 = fVar147 - (fVar108 * fVar170 + fVar107 * fVar172);
                fVar78 = ABS(fVar108);
                if (ABS(fVar108) <= ABS(fVar107)) {
                  fVar78 = ABS(fVar107);
                }
                if (fVar78 < fVar148) {
                  if ((((0.0 <= fVar129) && (fVar129 <= 1.0)) && (0.0 <= fVar147)) &&
                     (fVar147 <= 1.0)) {
                    fVar78 = (pre->ray_space).vx.field_0.m128[2];
                    fVar107 = (pre->ray_space).vy.field_0.m128[2];
                    fVar108 = (pre->ray_space).vz.field_0.m128[2];
                    fVar109 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fVar128 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar130 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fVar171 = 1.0 - fVar147;
                    fVar170 = 1.0 - fVar129;
                    fVar165 = fVar170 * fVar170 * fVar170;
                    fVar166 = fVar129 * fVar149 * fVar170 * fVar170;
                    fVar167 = fVar129 * fVar129 * fVar129;
                    fVar149 = fVar129 * fVar129 * fVar149 * fVar170;
                    fVar78 = (((fStack_370 - fVar130) * fVar108 +
                              (fStack_374 - fVar128) * fVar107 + (local_378 - fVar109) * fVar78) *
                              fVar171 +
                             ((fStack_360 - fVar130) * fVar108 +
                             (fStack_364 - fVar128) * fVar107 + (local_368 - fVar109) * fVar78) *
                             fVar147) * fVar165 +
                             (((fStack_380 - fVar130) * fVar108 +
                              (fStack_384 - fVar128) * fVar107 + (local_388 - fVar109) * fVar78) *
                              fVar171 +
                             ((fStack_3c0 - fVar130) * fVar108 +
                             (fStack_3c4 - fVar128) * fVar107 + (local_3c8 - fVar109) * fVar78) *
                             fVar147) * fVar166 +
                             (((fStack_3a0 - fVar130) * fVar108 +
                              (fStack_3a4 - fVar128) * fVar107 + (local_3a8 - fVar109) * fVar78) *
                              fVar171 +
                             ((local_3dc.m128[3] - fVar130) * fVar108 +
                             (local_3dc.m128[2] - fVar128) * fVar107 +
                             (local_3dc.m128[1] - fVar109) * fVar78) * fVar147) * fVar149 +
                             (fVar171 * ((fStack_390 - fVar130) * fVar108 +
                                        (fStack_394 - fVar128) * fVar107 +
                                        (local_398 - fVar109) * fVar78) +
                             ((fStack_2b0 - fVar130) * fVar108 +
                             (fStack_2b4 - fVar128) * fVar107 + (local_2b8 - fVar109) * fVar78) *
                             fVar147) * fVar167;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar78) &&
                       (fVar107 = (ray->super_RayK<1>).tfar, fVar78 <= fVar107)) {
                      fVar130 = 1.0 - fVar147;
                      fVar171 = 1.0 - fVar147;
                      fVar172 = 1.0 - fVar147;
                      fVar108 = local_388 * fVar130 + local_3c8 * fVar147;
                      fVar109 = fStack_384 * fVar171 + fStack_3c4 * fVar147;
                      fVar128 = fStack_380 * fVar172 + fStack_3c0 * fVar147;
                      fVar195 = local_3a8 * fVar130 + local_3dc.m128[1] * fVar147;
                      fVar197 = fStack_3a4 * fVar171 + local_3dc.m128[2] * fVar147;
                      fVar208 = fStack_3a0 * fVar172 + local_3dc.m128[3] * fVar147;
                      fVar196 = fVar195 - fVar108;
                      fVar207 = fVar197 - fVar109;
                      fVar209 = fVar208 - fVar128;
                      fVar108 = (((fVar108 - (local_378 * fVar130 + local_368 * fVar147)) * fVar170
                                 + fVar129 * fVar196) * fVar170 +
                                (fVar196 * fVar170 +
                                ((fVar130 * local_398 + fVar147 * local_2b8) - fVar195) * fVar129) *
                                fVar129) * 3.0;
                      fVar109 = (((fVar109 - (fStack_374 * fVar171 + fStack_364 * fVar147)) *
                                  fVar170 + fVar129 * fVar207) * fVar170 +
                                (fVar207 * fVar170 +
                                ((fVar171 * fStack_394 + fVar147 * fStack_2b4) - fVar197) * fVar129)
                                * fVar129) * 3.0;
                      fVar128 = (((fVar128 - (fStack_370 * fVar172 + fStack_360 * fVar147)) *
                                  fVar170 + fVar129 * fVar209) * fVar170 +
                                (fVar209 * fVar170 +
                                ((fVar172 * fStack_390 + fVar147 * fStack_2b0) - fVar208) * fVar129)
                                * fVar129) * 3.0;
                      pGVar19 = (context->scene->geometries).items[uVar73].ptr;
                      uVar75 = (ray->super_RayK<1>).mask;
                      paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar75;
                      pRVar66 = (RTCIntersectArguments *)context;
                      if ((pGVar19->mask & uVar75) != 0) {
                        fVar170 = fVar165 * local_178 +
                                  fVar166 * local_188 + fVar149 * local_198 + fVar167 * local_1a8;
                        fVar171 = fVar165 * fStack_174 +
                                  fVar166 * fStack_184 + fVar149 * fStack_194 + fVar167 * fStack_1a4
                        ;
                        fVar149 = fVar165 * fStack_170 +
                                  fVar166 * fStack_180 + fVar149 * fStack_190 + fVar167 * fStack_1a0
                        ;
                        fVar130 = fVar171 * fVar108 - fVar109 * fVar170;
                        fVar109 = fVar149 * fVar109 - fVar128 * fVar171;
                        fVar108 = fVar170 * fVar128 - fVar108 * fVar149;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar78;
                          *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar108,fVar109);
                          (ray->Ng).field_0.field_0.z = fVar130;
                          ray->u = fVar129;
                          ray->v = fVar147;
                          ray->primID = (uint)local_340;
                          ray->geomID = uVar73;
                          ray->instID[0] = context->user->instID[0];
                          uVar75 = context->user->instPrimID[0];
                          ray->instPrimID[0] = uVar75;
                          paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar75;
                        }
                        else {
                          local_1e8 = CONCAT44(fVar108,fVar109);
                          local_1e0 = fVar130;
                          local_1dc = fVar129;
                          fStack_1d8 = fVar147;
                          local_1d4 = (uint)local_340;
                          local_1d0 = uVar73;
                          local_1cc = context->user->instID[0];
                          pRVar66 = (RTCIntersectArguments *)(ulong)local_1cc;
                          local_1c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar78;
                          local_3dc.m128[0] = -NAN;
                          local_2e8.valid = (int *)&local_3dc;
                          local_2e8.geometryUserPtr = pGVar19->userPtr;
                          local_2e8.context = context->user;
                          local_2e8.ray = (RTCRayN *)ray;
                          local_2e8.hit = (RTCHitN *)&local_1e8;
                          local_2e8.N = 1;
                          if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bcff54:
                            pRVar66 = context->args;
                            if ((RTCIntersectArguments *)pRVar66->filter !=
                                (RTCIntersectArguments *)0x0) {
                              if ((((ulong)*(Scene **)&pRVar66->flags & 2) != 0) ||
                                 (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                                (*(code *)pRVar66->filter)(&local_2e8);
                              }
                              if (*(float *)local_2e8.valid == 0.0) goto LAB_00bcfff0;
                            }
                            *(float *)((long)local_2e8.ray + 0x30) = *(float *)local_2e8.hit;
                            *(float *)((long)local_2e8.ray + 0x34) = *(float *)(local_2e8.hit + 4);
                            *(float *)((long)local_2e8.ray + 0x38) = *(float *)(local_2e8.hit + 8);
                            *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc)
                            ;
                            *(float *)((long)local_2e8.ray + 0x40) =
                                 *(float *)(local_2e8.hit + 0x10);
                            *(float *)((long)local_2e8.ray + 0x44) =
                                 *(float *)(local_2e8.hit + 0x14);
                            *(float *)((long)local_2e8.ray + 0x48) =
                                 *(float *)(local_2e8.hit + 0x18);
                            *(float *)((long)local_2e8.ray + 0x4c) =
                                 *(float *)(local_2e8.hit + 0x1c);
                            pRVar66 = (RTCIntersectArguments *)
                                      (ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                            *(float *)((long)local_2e8.ray + 0x50) =
                                 *(float *)(local_2e8.hit + 0x20);
                            paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.ray;
                          }
                          else {
                            uStack_3b0 = auVar103._8_8_;
                            local_3b8 = auVar69;
                            (*pGVar19->intersectionFilterN)(&local_2e8);
                            auVar69 = local_3b8;
                            if (*(float *)local_2e8.valid != 0.0) goto LAB_00bcff54;
LAB_00bcfff0:
                            (ray->super_RayK<1>).tfar = fVar107;
                            paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.valid;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar63 + -1);
              } while (paVar63 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
            }
            else {
              bVar25 = false;
              paVar63 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar32,bVar60);
            }
          }
        }
      }
    } while (bVar25);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }